

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  Geometry *geometry;
  long lVar68;
  bool bVar69;
  ulong uVar70;
  byte bVar71;
  float fVar72;
  float fVar122;
  float fVar124;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar73;
  undefined1 auVar84 [16];
  float fVar123;
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar126;
  float fVar129;
  float fVar130;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar131;
  float fVar136;
  float fVar137;
  vint4 bi_2;
  float fVar138;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined8 uVar139;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar172;
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  RTCFilterFunctionNArguments args;
  int local_52c;
  RayQueryContext *local_528;
  Primitive *local_520;
  Ray *local_518;
  ulong local_510;
  Precalculations *local_508;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  Geometry *local_4a0;
  ulong local_498;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  ulong local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar64 = (ulong)(byte)PVar9;
  lVar29 = uVar64 * 0x25;
  fVar169 = *(float *)(prim + lVar29 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar29 + 6));
  auVar148._0_4_ = fVar169 * (ray->dir).field_0.m128[0];
  auVar148._4_4_ = fVar169 * (ray->dir).field_0.m128[1];
  auVar148._8_4_ = fVar169 * (ray->dir).field_0.m128[2];
  auVar148._12_4_ = fVar169 * (ray->dir).field_0.m128[3];
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar159._0_4_ = fVar169 * auVar81._0_4_;
  auVar159._4_4_ = fVar169 * auVar81._4_4_;
  auVar159._8_4_ = fVar169 * auVar81._8_4_;
  auVar159._12_4_ = fVar169 * auVar81._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar64 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar165._4_4_ = auVar148._0_4_;
  auVar165._0_4_ = auVar148._0_4_;
  auVar165._8_4_ = auVar148._0_4_;
  auVar165._12_4_ = auVar148._0_4_;
  auVar26 = vshufps_avx(auVar148,auVar148,0x55);
  auVar27 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar169 = auVar27._0_4_;
  auVar149._0_4_ = fVar169 * auVar75._0_4_;
  fVar136 = auVar27._4_4_;
  auVar149._4_4_ = fVar136 * auVar75._4_4_;
  fVar137 = auVar27._8_4_;
  auVar149._8_4_ = fVar137 * auVar75._8_4_;
  fVar138 = auVar27._12_4_;
  auVar149._12_4_ = fVar138 * auVar75._12_4_;
  auVar140._0_4_ = auVar76._0_4_ * fVar169;
  auVar140._4_4_ = auVar76._4_4_ * fVar136;
  auVar140._8_4_ = auVar76._8_4_ * fVar137;
  auVar140._12_4_ = auVar76._12_4_ * fVar138;
  auVar84._0_4_ = auVar77._0_4_ * fVar169;
  auVar84._4_4_ = auVar77._4_4_ * fVar136;
  auVar84._8_4_ = auVar77._8_4_ * fVar137;
  auVar84._12_4_ = auVar77._12_4_ * fVar138;
  auVar27 = vfmadd231ps_fma(auVar149,auVar26,auVar81);
  auVar31 = vfmadd231ps_fma(auVar140,auVar26,auVar23);
  auVar26 = vfmadd231ps_fma(auVar84,auVar25,auVar26);
  auVar27 = vfmadd231ps_fma(auVar27,auVar165,auVar82);
  auVar31 = vfmadd231ps_fma(auVar31,auVar165,auVar22);
  auVar83 = vfmadd231ps_fma(auVar26,auVar24,auVar165);
  auVar186._4_4_ = auVar159._0_4_;
  auVar186._0_4_ = auVar159._0_4_;
  auVar186._8_4_ = auVar159._0_4_;
  auVar186._12_4_ = auVar159._0_4_;
  auVar26 = vshufps_avx(auVar159,auVar159,0x55);
  auVar74 = vshufps_avx512vl(auVar159,auVar159,0xaa);
  auVar75 = vmulps_avx512vl(auVar74,auVar75);
  auVar76 = vmulps_avx512vl(auVar74,auVar76);
  auVar77 = vmulps_avx512vl(auVar74,auVar77);
  auVar81 = vfmadd231ps_fma(auVar75,auVar26,auVar81);
  auVar75 = vfmadd231ps_fma(auVar76,auVar26,auVar23);
  auVar23 = vfmadd231ps_fma(auVar77,auVar26,auVar25);
  auVar32 = vfmadd231ps_fma(auVar81,auVar186,auVar82);
  auVar84 = vfmadd231ps_fma(auVar75,auVar186,auVar22);
  auVar176._8_4_ = 0x7fffffff;
  auVar176._0_8_ = 0x7fffffff7fffffff;
  auVar176._12_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(auVar23,auVar186,auVar24);
  auVar82 = vandps_avx(auVar176,auVar27);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar82,auVar173,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar78._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._12_4_;
  auVar82 = vandps_avx(auVar176,auVar31);
  uVar70 = vcmpps_avx512vl(auVar82,auVar173,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar79._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar31._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar31._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar31._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar31._12_4_;
  auVar82 = vandps_avx(auVar176,auVar83);
  uVar70 = vcmpps_avx512vl(auVar82,auVar173,1);
  bVar69 = (bool)((byte)uVar70 & 1);
  auVar80._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._0_4_;
  bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._4_4_;
  bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._8_4_;
  bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar78);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = 0x3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar78,auVar81,auVar174);
  auVar83 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar82 = vfnmadd213ps_fma(auVar79,auVar81,auVar174);
  auVar74 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar80);
  auVar82 = vfnmadd213ps_fma(auVar80,auVar81,auVar174);
  auVar30 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  fVar169 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar29 + 0x16)) *
            *(float *)(prim + lVar29 + 0x1a);
  auVar170._4_4_ = fVar169;
  auVar170._0_4_ = fVar169;
  auVar170._8_4_ = fVar169;
  auVar170._12_4_ = fVar169;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar22 = vsubps_avx(auVar81,auVar82);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar75 = vfmadd213ps_fma(auVar22,auVar170,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar81);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar81 = vpmovsxwd_avx(auVar22);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar22 = vfmadd213ps_fma(auVar81,auVar170,auVar82);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar82 = vpmovsxwd_avx(auVar23);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar70 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar70 + 6);
  auVar81 = vpmovsxwd_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar23 = vfmadd213ps_fma(auVar81,auVar170,auVar82);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar82 = vpmovsxwd_avx(auVar24);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar25);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar76 = vfmadd213ps_fma(auVar81,auVar170,auVar82);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar82 = vpmovsxwd_avx(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar9 * 0x20 + 6);
  auVar81 = vpmovsxwd_avx(auVar26);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar24 = vfmadd213ps_fma(auVar81,auVar170,auVar82);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar9 * 0x20 - uVar64) + 6);
  auVar82 = vpmovsxwd_avx(auVar27);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar31);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar81 = vfmadd213ps_fma(auVar81,auVar170,auVar82);
  auVar82 = vsubps_avx(auVar75,auVar32);
  auVar171._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar171._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar171._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar171._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar22,auVar32);
  auVar150._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar150._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar150._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar150._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar23,auVar84);
  auVar166._0_4_ = auVar74._0_4_ * auVar82._0_4_;
  auVar166._4_4_ = auVar74._4_4_ * auVar82._4_4_;
  auVar166._8_4_ = auVar74._8_4_ * auVar82._8_4_;
  auVar166._12_4_ = auVar74._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar76,auVar84);
  auVar141._0_4_ = auVar74._0_4_ * auVar82._0_4_;
  auVar141._4_4_ = auVar74._4_4_ * auVar82._4_4_;
  auVar141._8_4_ = auVar74._8_4_ * auVar82._8_4_;
  auVar141._12_4_ = auVar74._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar24,auVar132);
  auVar160._0_4_ = auVar30._0_4_ * auVar82._0_4_;
  auVar160._4_4_ = auVar30._4_4_ * auVar82._4_4_;
  auVar160._8_4_ = auVar30._8_4_ * auVar82._8_4_;
  auVar160._12_4_ = auVar30._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar81,auVar132);
  auVar132._0_4_ = auVar30._0_4_ * auVar82._0_4_;
  auVar132._4_4_ = auVar30._4_4_ * auVar82._4_4_;
  auVar132._8_4_ = auVar30._8_4_ * auVar82._8_4_;
  auVar132._12_4_ = auVar30._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar171,auVar150);
  auVar81 = vpminsd_avx(auVar166,auVar141);
  auVar82 = vmaxps_avx(auVar82,auVar81);
  auVar81 = vpminsd_avx(auVar160,auVar132);
  uVar131 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar83._4_4_ = uVar131;
  auVar83._0_4_ = uVar131;
  auVar83._8_4_ = uVar131;
  auVar83._12_4_ = uVar131;
  auVar81 = vmaxps_avx512vl(auVar81,auVar83);
  auVar82 = vmaxps_avx(auVar82,auVar81);
  auVar74._8_4_ = 0x3f7ffffa;
  auVar74._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar74._12_4_ = 0x3f7ffffa;
  local_250 = vmulps_avx512vl(auVar82,auVar74);
  auVar82 = vpmaxsd_avx(auVar171,auVar150);
  auVar81 = vpmaxsd_avx(auVar166,auVar141);
  auVar82 = vminps_avx(auVar82,auVar81);
  auVar81 = vpmaxsd_avx(auVar160,auVar132);
  fVar169 = ray->tfar;
  auVar30._4_4_ = fVar169;
  auVar30._0_4_ = fVar169;
  auVar30._8_4_ = fVar169;
  auVar30._12_4_ = fVar169;
  auVar81 = vminps_avx512vl(auVar81,auVar30);
  auVar82 = vminps_avx(auVar82,auVar81);
  auVar32._8_4_ = 0x3f800003;
  auVar32._0_8_ = 0x3f8000033f800003;
  auVar32._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar32);
  local_508 = pre;
  auVar81 = vpbroadcastd_avx512vl();
  uVar139 = vcmpps_avx512vl(local_250,auVar82,2);
  uVar70 = vpcmpgtd_avx512vl(auVar81,_DAT_01f7fcf0);
  uVar70 = ((byte)uVar139 & 0xf) & uVar70;
  if ((char)uVar70 == '\0') {
    bVar69 = false;
  }
  else {
    local_518 = ray;
    local_528 = context;
    local_520 = prim;
    do {
      lVar29 = 0;
      for (uVar64 = uVar70; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      local_510 = (ulong)*(uint *)(local_520 + 2);
      pGVar11 = (context->scene->geometries).items[*(uint *)(local_520 + 2)].ptr;
      local_498 = (ulong)*(uint *)(local_520 + lVar29 * 4 + 6);
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               (ulong)*(uint *)(local_520 + lVar29 * 4 + 6) *
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar169 = (pGVar11->time_range).lower;
      fVar169 = pGVar11->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar169) / ((pGVar11->time_range).upper - fVar169));
      auVar82 = vroundss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),9);
      auVar82 = vminss_avx(auVar82,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
      fVar169 = fVar169 - auVar82._0_4_;
      fVar136 = 1.0 - fVar169;
      _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar66 = (long)(int)auVar82._0_4_ * 0x38;
      lVar68 = *(long *)(_Var12 + 0x10 + lVar66);
      lVar13 = *(long *)(_Var12 + 0x38 + lVar66);
      lVar14 = *(long *)(_Var12 + 0x48 + lVar66);
      auVar133._4_4_ = fVar169;
      auVar133._0_4_ = fVar169;
      auVar133._8_4_ = fVar169;
      auVar133._12_4_ = fVar169;
      pfVar3 = (float *)(lVar13 + lVar14 * uVar64);
      auVar177._0_4_ = fVar169 * *pfVar3;
      auVar177._4_4_ = fVar169 * pfVar3[1];
      auVar177._8_4_ = fVar169 * pfVar3[2];
      auVar177._12_4_ = fVar169 * pfVar3[3];
      lVar29 = uVar64 + 1;
      auVar82 = vmulps_avx512vl(auVar133,*(undefined1 (*) [16])(lVar13 + lVar14 * lVar29));
      p_Var15 = pGVar11[4].occlusionFilterN;
      auVar142._4_4_ = fVar136;
      auVar142._0_4_ = fVar136;
      auVar142._8_4_ = fVar136;
      auVar142._12_4_ = fVar136;
      local_460 = vfmadd231ps_fma(auVar177,auVar142,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var12 + lVar66) + lVar68 * uVar64));
      _local_310 = vfmadd231ps_avx512vl
                             (auVar82,auVar142,
                              *(undefined1 (*) [16])(*(long *)(_Var12 + lVar66) + lVar68 * lVar29));
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar66 + 0x38) +
                        uVar64 * *(long *)(p_Var15 + lVar66 + 0x48));
      auVar181._0_4_ = fVar169 * *pfVar3;
      auVar181._4_4_ = fVar169 * pfVar3[1];
      auVar181._8_4_ = fVar169 * pfVar3[2];
      auVar181._12_4_ = fVar169 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var15 + lVar66 + 0x38) +
                        *(long *)(p_Var15 + lVar66 + 0x48) * lVar29);
      auVar182._0_4_ = fVar169 * *pfVar3;
      auVar182._4_4_ = fVar169 * pfVar3[1];
      auVar182._8_4_ = fVar169 * pfVar3[2];
      auVar182._12_4_ = fVar169 * pfVar3[3];
      auVar82 = vfmadd231ps_fma(auVar181,auVar142,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var15 + lVar66) +
                                 *(long *)(p_Var15 + lVar66 + 0x10) * uVar64));
      auVar81 = vfmadd231ps_fma(auVar182,auVar142,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var15 + lVar66) +
                                 *(long *)(p_Var15 + lVar66 + 0x10) * lVar29));
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar29 = (long)iVar10 * 0x44;
      auVar134._8_4_ = 0xbeaaaaab;
      auVar134._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar134._12_4_ = 0xbeaaaaab;
      local_470 = vfnmadd213ps_fma(auVar82,auVar134,local_460);
      local_480 = vfmadd213ps_avx512vl(auVar81,auVar134,_local_310);
      aVar4 = (local_518->org).field_0;
      auVar81 = vsubps_avx(local_460,(undefined1  [16])aVar4);
      uVar131 = auVar81._0_4_;
      auVar143._4_4_ = uVar131;
      auVar143._0_4_ = uVar131;
      auVar143._8_4_ = uVar131;
      auVar143._12_4_ = uVar131;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      aVar5 = (local_508->ray_space).vx.field_0;
      aVar6 = (local_508->ray_space).vy.field_0;
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      fVar169 = (local_508->ray_space).vz.field_0.m128[0];
      fVar136 = (local_508->ray_space).vz.field_0.m128[1];
      fVar137 = (local_508->ray_space).vz.field_0.m128[2];
      fVar138 = (local_508->ray_space).vz.field_0.m128[3];
      auVar179._0_4_ = auVar81._0_4_ * fVar169;
      auVar179._4_4_ = auVar81._4_4_ * fVar136;
      auVar179._8_4_ = auVar81._8_4_ * fVar137;
      auVar179._12_4_ = auVar81._12_4_ * fVar138;
      auVar82 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar6,auVar82);
      auVar75 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar143);
      auVar81 = vsubps_avx(local_470,(undefined1  [16])aVar4);
      uVar131 = auVar81._0_4_;
      auVar144._4_4_ = uVar131;
      auVar144._0_4_ = uVar131;
      auVar144._8_4_ = uVar131;
      auVar144._12_4_ = uVar131;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar183._0_4_ = auVar81._0_4_ * fVar169;
      auVar183._4_4_ = auVar81._4_4_ * fVar136;
      auVar183._8_4_ = auVar81._8_4_ * fVar137;
      auVar183._12_4_ = auVar81._12_4_ * fVar138;
      auVar82 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar6,auVar82);
      auVar22 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar144);
      auVar81 = vsubps_avx(local_480,(undefined1  [16])aVar4);
      uVar131 = auVar81._0_4_;
      auVar145._4_4_ = uVar131;
      auVar145._0_4_ = uVar131;
      auVar145._8_4_ = uVar131;
      auVar145._12_4_ = uVar131;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar184._0_4_ = fVar169 * auVar81._0_4_;
      auVar184._4_4_ = fVar136 * auVar81._4_4_;
      auVar184._8_4_ = fVar137 * auVar81._8_4_;
      auVar184._12_4_ = fVar138 * auVar81._12_4_;
      auVar82 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar6,auVar82);
      auVar23 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar145);
      local_2a0 = ZEXT1632((undefined1  [16])aVar4);
      auVar81 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar4);
      uVar131 = auVar81._0_4_;
      auVar146._4_4_ = uVar131;
      auVar146._0_4_ = uVar131;
      auVar146._8_4_ = uVar131;
      auVar146._12_4_ = uVar131;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar187._0_4_ = auVar81._0_4_ * fVar169;
      auVar187._4_4_ = auVar81._4_4_ * fVar136;
      auVar187._8_4_ = auVar81._8_4_ * fVar137;
      auVar187._12_4_ = auVar81._12_4_ * fVar138;
      auVar82 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar6,auVar82);
      auVar76 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar146);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar29);
      uVar131 = auVar75._0_4_;
      local_3c0._4_4_ = uVar131;
      local_3c0._0_4_ = uVar131;
      local_3c0._8_4_ = uVar131;
      local_3c0._12_4_ = uVar131;
      local_3c0._16_4_ = uVar131;
      local_3c0._20_4_ = uVar131;
      local_3c0._24_4_ = uVar131;
      local_3c0._28_4_ = uVar131;
      auVar85._8_4_ = 1;
      auVar85._0_8_ = 0x100000001;
      auVar85._12_4_ = 1;
      auVar85._16_4_ = 1;
      auVar85._20_4_ = 1;
      auVar85._24_4_ = 1;
      auVar85._28_4_ = 1;
      local_340 = vpermps_avx2(auVar85,ZEXT1632(auVar75));
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x484);
      uVar131 = auVar22._0_4_;
      local_3e0._4_4_ = uVar131;
      local_3e0._0_4_ = uVar131;
      local_3e0._8_4_ = uVar131;
      local_3e0._12_4_ = uVar131;
      local_3e0._16_4_ = uVar131;
      local_3e0._20_4_ = uVar131;
      local_3e0._24_4_ = uVar131;
      local_3e0._28_4_ = uVar131;
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x908);
      local_360 = vpermps_avx512vl(auVar85,ZEXT1632(auVar22));
      local_400 = vbroadcastss_avx512vl(auVar23);
      local_420 = vpermps_avx512vl(auVar85,ZEXT1632(auVar23));
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0xd8c);
      uVar131 = auVar76._0_4_;
      local_380._4_4_ = uVar131;
      local_380._0_4_ = uVar131;
      local_380._8_4_ = uVar131;
      local_380._12_4_ = uVar131;
      local_380._16_4_ = uVar131;
      local_380._20_4_ = uVar131;
      local_380._24_4_ = uVar131;
      local_380._28_4_ = uVar131;
      local_3a0 = vpermps_avx512vl(auVar85,ZEXT1632(auVar76));
      auVar85 = vmulps_avx512vl(local_380,auVar97);
      auVar86 = vmulps_avx512vl(local_3a0,auVar97);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_400);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_420);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_3e0);
      auVar87 = vfmadd231ps_avx512vl(auVar86,auVar100,local_360);
      auVar88 = vfmadd231ps_avx512vl(auVar85,auVar99,local_3c0);
      auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar29);
      auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x484);
      auVar89 = vfmadd231ps_avx512vl(auVar87,auVar99,local_340);
      auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x908);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0xd8c);
      auVar197 = ZEXT3264(local_380);
      auVar90 = vmulps_avx512vl(local_380,auVar96);
      auVar195 = ZEXT3264(local_3a0);
      auVar91 = vmulps_avx512vl(local_3a0,auVar96);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_400);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_420);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_3e0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_360);
      auVar24 = vfmadd231ps_fma(auVar90,auVar85,local_3c0);
      auVar25 = vfmadd231ps_fma(auVar91,auVar85,local_340);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar24),auVar88);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar25),auVar89);
      auVar92 = vmulps_avx512vl(auVar89,auVar90);
      auVar93 = vmulps_avx512vl(auVar88,auVar91);
      auVar92 = vsubps_avx512vl(auVar92,auVar93);
      auVar82 = vshufps_avx(local_460,local_460,0xff);
      uVar139 = auVar82._0_8_;
      local_80._8_8_ = uVar139;
      local_80._0_8_ = uVar139;
      local_80._16_8_ = uVar139;
      local_80._24_8_ = uVar139;
      auVar82 = vshufps_avx(local_470,local_470,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx(local_480,local_480,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(_local_310,_local_310,0xff);
      uVar139 = auVar82._0_8_;
      register0x000012c8 = uVar139;
      local_e0 = uVar139;
      register0x000012d0 = uVar139;
      register0x000012d8 = uVar139;
      auVar93 = vmulps_avx512vl(_local_e0,auVar97);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_a0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_80);
      auVar94 = vmulps_avx512vl(_local_e0,auVar96);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar87,local_c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,local_a0);
      auVar77 = vfmadd231ps_fma(auVar94,auVar85,local_80);
      auVar94 = vmulps_avx512vl(auVar91,auVar91);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar90);
      auVar95 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar77));
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      uVar139 = vcmpps_avx512vl(auVar92,auVar94,2);
      auVar31 = local_460;
      auVar82 = vblendps_avx(auVar75,local_460,8);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar81 = vandps_avx512vl(auVar82,auVar83);
      auVar27 = local_470;
      auVar82 = vblendps_avx(auVar22,local_470,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar81 = vmaxps_avx(auVar81,auVar82);
      auVar26 = local_480;
      auVar82 = vblendps_avx(auVar23,local_480,8);
      auVar74 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vblendps_avx(auVar76,_local_310,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vmaxps_avx(auVar74,auVar82);
      auVar82 = vmaxps_avx(auVar81,auVar82);
      auVar81 = vmovshdup_avx(auVar82);
      auVar81 = vmaxss_avx(auVar81,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar81);
      local_2c0._0_4_ = (undefined4)iVar10;
      register0x00001404 = local_480._4_12_;
      auVar94._4_4_ = local_2c0._0_4_;
      auVar94._0_4_ = local_2c0._0_4_;
      auVar94._8_4_ = local_2c0._0_4_;
      auVar94._12_4_ = local_2c0._0_4_;
      auVar94._16_4_ = local_2c0._0_4_;
      auVar94._20_4_ = local_2c0._0_4_;
      auVar94._24_4_ = local_2c0._0_4_;
      auVar94._28_4_ = local_2c0._0_4_;
      uVar28 = vcmpps_avx512vl(auVar94,_DAT_01faff40,0xe);
      bVar71 = (byte)uVar139 & (byte)uVar28;
      auVar82 = vmulss_avx512f(auVar82,ZEXT416(0x35000000));
      auVar92._8_4_ = 2;
      auVar92._0_8_ = 0x200000002;
      auVar92._12_4_ = 2;
      auVar92._16_4_ = 2;
      auVar92._20_4_ = 2;
      auVar92._24_4_ = 2;
      auVar92._28_4_ = 2;
      local_2e0 = vpermps_avx2(auVar92,ZEXT1632(auVar75));
      local_100 = vpermps_avx512vl(auVar92,ZEXT1632(auVar22));
      local_120 = vpermps_avx512vl(auVar92,ZEXT1632(auVar23));
      local_440 = vpermps_avx2(auVar92,ZEXT1632(auVar76));
      auVar81 = local_100._0_16_;
      if (bVar71 == 0) {
        bVar69 = false;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar99);
        auVar81 = vxorps_avx512vl(auVar81,auVar81);
        auVar191 = ZEXT1664(auVar81);
        auVar194 = ZEXT3264(local_3c0);
        auVar192 = ZEXT3264(local_340);
        auVar193 = ZEXT3264(local_3e0);
        auVar199 = ZEXT3264(local_360);
        auVar198 = ZEXT3264(local_400);
        auVar196 = ZEXT3264(local_420);
        local_480 = auVar26;
        local_470 = auVar27;
        local_460 = auVar31;
      }
      else {
        auVar96 = vmulps_avx512vl(local_440,auVar96);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_120,auVar96);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_100,auVar87);
        auVar92 = vfmadd213ps_avx512vl(auVar85,local_2e0,auVar86);
        auVar97 = vmulps_avx512vl(local_440,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar97);
        auVar86 = vfmadd213ps_avx512vl(auVar100,local_100,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1694);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1b18);
        auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar29 + 0x1f9c);
        auVar94 = vfmadd213ps_avx512vl(auVar99,local_2e0,auVar86);
        auVar99 = vmulps_avx512vl(local_380,auVar85);
        auVar86 = vmulps_avx512vl(local_3a0,auVar85);
        auVar185._0_4_ = local_440._0_4_ * auVar85._0_4_;
        auVar185._4_4_ = local_440._4_4_ * auVar85._4_4_;
        auVar185._8_4_ = local_440._8_4_ * auVar85._8_4_;
        auVar185._12_4_ = local_440._12_4_ * auVar85._12_4_;
        auVar185._16_4_ = local_440._16_4_ * auVar85._16_4_;
        auVar185._20_4_ = local_440._20_4_ * auVar85._20_4_;
        auVar185._24_4_ = local_440._24_4_ * auVar85._24_4_;
        auVar185._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_400);
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar97,local_420);
        auVar97 = vfmadd231ps_avx512vl(auVar185,local_120,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_3e0);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_360);
        auVar86 = vfmadd231ps_avx512vl(auVar97,local_100,auVar98);
        auVar87 = vfmadd231ps_avx512vl(auVar99,auVar100,local_3c0);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_340);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1f9c);
        auVar86 = vfmadd231ps_avx512vl(auVar86,local_2e0,auVar100);
        auVar96 = vmulps_avx512vl(local_380,auVar97);
        auVar95 = vmulps_avx512vl(local_3a0,auVar97);
        auVar100._4_4_ = local_440._4_4_ * auVar97._4_4_;
        auVar100._0_4_ = local_440._0_4_ * auVar97._0_4_;
        auVar100._8_4_ = local_440._8_4_ * auVar97._8_4_;
        auVar100._12_4_ = local_440._12_4_ * auVar97._12_4_;
        auVar100._16_4_ = local_440._16_4_ * auVar97._16_4_;
        auVar100._20_4_ = local_440._20_4_ * auVar97._20_4_;
        auVar100._24_4_ = local_440._24_4_ * auVar97._24_4_;
        auVar100._28_4_ = auVar97._28_4_;
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar98,local_400);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar98,local_420);
        auVar98 = vfmadd231ps_avx512vl(auVar100,local_120,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar29 + 0x1694);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_3e0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar98,local_100,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar97,auVar99,local_3c0);
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar99,local_340);
        auVar96 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar99);
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar87,auVar188);
        auVar100 = vandps_avx(auVar85,auVar188);
        auVar100 = vmaxps_avx(auVar99,auVar100);
        auVar99 = vandps_avx(auVar86,auVar188);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        auVar86 = vbroadcastss_avx512vl(auVar82);
        uVar64 = vcmpps_avx512vl(auVar99,auVar86,1);
        bVar69 = (bool)((byte)uVar64 & 1);
        auVar111._0_4_ = (float)((uint)bVar69 * auVar90._0_4_ | (uint)!bVar69 * auVar87._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * auVar87._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * auVar87._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * auVar87._12_4_);
        bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * auVar87._16_4_);
        bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * auVar87._20_4_);
        bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * auVar87._24_4_);
        bVar69 = SUB81(uVar64 >> 7,0);
        auVar111._28_4_ = (uint)bVar69 * auVar90._28_4_ | (uint)!bVar69 * auVar87._28_4_;
        bVar69 = (bool)((byte)uVar64 & 1);
        auVar101._0_4_ = (float)((uint)bVar69 * auVar91._0_4_ | (uint)!bVar69 * auVar85._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar69 * auVar91._4_4_ | (uint)!bVar69 * auVar85._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar69 * auVar91._8_4_ | (uint)!bVar69 * auVar85._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar69 * auVar91._12_4_ | (uint)!bVar69 * auVar85._12_4_);
        bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar69 * auVar91._16_4_ | (uint)!bVar69 * auVar85._16_4_);
        bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar69 * auVar91._20_4_ | (uint)!bVar69 * auVar85._20_4_);
        bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar69 * auVar91._24_4_ | (uint)!bVar69 * auVar85._24_4_);
        bVar69 = SUB81(uVar64 >> 7,0);
        auVar101._28_4_ = (uint)bVar69 * auVar91._28_4_ | (uint)!bVar69 * auVar85._28_4_;
        auVar99 = vandps_avx(auVar188,auVar98);
        auVar100 = vandps_avx(auVar97,auVar188);
        auVar100 = vmaxps_avx(auVar99,auVar100);
        auVar99 = vandps_avx(auVar96,auVar188);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        uVar64 = vcmpps_avx512vl(auVar99,auVar86,1);
        bVar69 = (bool)((byte)uVar64 & 1);
        auVar102._0_4_ = (float)((uint)bVar69 * auVar90._0_4_ | (uint)!bVar69 * auVar98._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * auVar98._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * auVar98._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * auVar98._12_4_);
        bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar69 * auVar90._16_4_ | (uint)!bVar69 * auVar98._16_4_);
        bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar69 * auVar90._20_4_ | (uint)!bVar69 * auVar98._20_4_);
        bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar69 * auVar90._24_4_ | (uint)!bVar69 * auVar98._24_4_);
        bVar69 = SUB81(uVar64 >> 7,0);
        auVar102._28_4_ = (uint)bVar69 * auVar90._28_4_ | (uint)!bVar69 * auVar98._28_4_;
        bVar69 = (bool)((byte)uVar64 & 1);
        auVar103._0_4_ = (float)((uint)bVar69 * auVar91._0_4_ | (uint)!bVar69 * auVar97._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar69 * auVar91._4_4_ | (uint)!bVar69 * auVar97._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar69 * auVar91._8_4_ | (uint)!bVar69 * auVar97._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar69 * auVar91._12_4_ | (uint)!bVar69 * auVar97._12_4_);
        bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar69 * auVar91._16_4_ | (uint)!bVar69 * auVar97._16_4_);
        bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar69 * auVar91._20_4_ | (uint)!bVar69 * auVar97._20_4_);
        bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar69 * auVar91._24_4_ | (uint)!bVar69 * auVar97._24_4_);
        bVar69 = SUB81(uVar64 >> 7,0);
        auVar103._28_4_ = (uint)bVar69 * auVar91._28_4_ | (uint)!bVar69 * auVar97._28_4_;
        auVar84 = vxorps_avx512vl(auVar81,auVar81);
        auVar191 = ZEXT1664(auVar84);
        auVar99 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar84));
        auVar81 = vfmadd231ps_fma(auVar99,auVar101,auVar101);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar169 = auVar100._0_4_;
        fVar136 = auVar100._4_4_;
        fVar137 = auVar100._8_4_;
        fVar138 = auVar100._12_4_;
        fVar178 = auVar100._16_4_;
        fVar172 = auVar100._20_4_;
        fVar72 = auVar100._24_4_;
        auVar99._4_4_ = fVar136 * fVar136 * fVar136 * auVar81._4_4_ * -0.5;
        auVar99._0_4_ = fVar169 * fVar169 * fVar169 * auVar81._0_4_ * -0.5;
        auVar99._8_4_ = fVar137 * fVar137 * fVar137 * auVar81._8_4_ * -0.5;
        auVar99._12_4_ = fVar138 * fVar138 * fVar138 * auVar81._12_4_ * -0.5;
        auVar99._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar99._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar99._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar99._28_4_ = auVar96._28_4_;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar100);
        auVar98._4_4_ = auVar101._4_4_ * auVar99._4_4_;
        auVar98._0_4_ = auVar101._0_4_ * auVar99._0_4_;
        auVar98._8_4_ = auVar101._8_4_ * auVar99._8_4_;
        auVar98._12_4_ = auVar101._12_4_ * auVar99._12_4_;
        auVar98._16_4_ = auVar101._16_4_ * auVar99._16_4_;
        auVar98._20_4_ = auVar101._20_4_ * auVar99._20_4_;
        auVar98._24_4_ = auVar101._24_4_ * auVar99._24_4_;
        auVar98._28_4_ = 0;
        auVar97._4_4_ = auVar99._4_4_ * -auVar111._4_4_;
        auVar97._0_4_ = auVar99._0_4_ * -auVar111._0_4_;
        auVar97._8_4_ = auVar99._8_4_ * -auVar111._8_4_;
        auVar97._12_4_ = auVar99._12_4_ * -auVar111._12_4_;
        auVar97._16_4_ = auVar99._16_4_ * -auVar111._16_4_;
        auVar97._20_4_ = auVar99._20_4_ * -auVar111._20_4_;
        auVar97._24_4_ = auVar99._24_4_ * -auVar111._24_4_;
        auVar97._28_4_ = auVar100._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar84));
        auVar90 = ZEXT1632(auVar84);
        auVar100 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar90);
        auVar81 = vfmadd231ps_fma(auVar100,auVar103,auVar103);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        fVar169 = auVar100._0_4_;
        fVar136 = auVar100._4_4_;
        fVar137 = auVar100._8_4_;
        fVar138 = auVar100._12_4_;
        fVar178 = auVar100._16_4_;
        fVar172 = auVar100._20_4_;
        fVar72 = auVar100._24_4_;
        auVar86._4_4_ = fVar136 * fVar136 * fVar136 * auVar81._4_4_ * -0.5;
        auVar86._0_4_ = fVar169 * fVar169 * fVar169 * auVar81._0_4_ * -0.5;
        auVar86._8_4_ = fVar137 * fVar137 * fVar137 * auVar81._8_4_ * -0.5;
        auVar86._12_4_ = fVar138 * fVar138 * fVar138 * auVar81._12_4_ * -0.5;
        auVar86._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar86._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar86._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar86._28_4_ = 0;
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar85,auVar100);
        auVar87._4_4_ = auVar103._4_4_ * auVar85._4_4_;
        auVar87._0_4_ = auVar103._0_4_ * auVar85._0_4_;
        auVar87._8_4_ = auVar103._8_4_ * auVar85._8_4_;
        auVar87._12_4_ = auVar103._12_4_ * auVar85._12_4_;
        auVar87._16_4_ = auVar103._16_4_ * auVar85._16_4_;
        auVar87._20_4_ = auVar103._20_4_ * auVar85._20_4_;
        auVar87._24_4_ = auVar103._24_4_ * auVar85._24_4_;
        auVar87._28_4_ = auVar100._28_4_;
        auVar96._4_4_ = -auVar102._4_4_ * auVar85._4_4_;
        auVar96._0_4_ = -auVar102._0_4_ * auVar85._0_4_;
        auVar96._8_4_ = -auVar102._8_4_ * auVar85._8_4_;
        auVar96._12_4_ = -auVar102._12_4_ * auVar85._12_4_;
        auVar96._16_4_ = -auVar102._16_4_ * auVar85._16_4_;
        auVar96._20_4_ = -auVar102._20_4_ * auVar85._20_4_;
        auVar96._24_4_ = -auVar102._24_4_ * auVar85._24_4_;
        auVar96._28_4_ = auVar101._28_4_;
        auVar100 = vmulps_avx512vl(auVar85,auVar90);
        auVar81 = vfmadd213ps_fma(auVar98,auVar93,auVar88);
        auVar75 = vfmadd213ps_fma(auVar97,auVar93,auVar89);
        auVar85 = vfmadd213ps_avx512vl(auVar99,auVar93,auVar94);
        auVar86 = vfmadd213ps_avx512vl(auVar87,ZEXT1632(auVar77),ZEXT1632(auVar24));
        auVar83 = vfnmadd213ps_fma(auVar98,auVar93,auVar88);
        auVar88 = ZEXT1632(auVar77);
        auVar22 = vfmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar25));
        auVar74 = vfnmadd213ps_fma(auVar97,auVar93,auVar89);
        auVar23 = vfmadd213ps_fma(auVar100,auVar88,auVar92);
        auVar98 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar99);
        auVar30 = vfnmadd213ps_fma(auVar87,auVar88,ZEXT1632(auVar24));
        auVar25 = vfnmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar25));
        auVar32 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar77),auVar100);
        auVar100 = vsubps_avx512vl(auVar86,ZEXT1632(auVar83));
        auVar99 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar74));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar23),auVar98);
        auVar87 = vmulps_avx512vl(auVar99,auVar98);
        auVar76 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar74),auVar97);
        auVar88._4_4_ = auVar83._4_4_ * auVar97._4_4_;
        auVar88._0_4_ = auVar83._0_4_ * auVar97._0_4_;
        auVar88._8_4_ = auVar83._8_4_ * auVar97._8_4_;
        auVar88._12_4_ = auVar83._12_4_ * auVar97._12_4_;
        auVar88._16_4_ = auVar97._16_4_ * 0.0;
        auVar88._20_4_ = auVar97._20_4_ * 0.0;
        auVar88._24_4_ = auVar97._24_4_ * 0.0;
        auVar88._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar88,auVar98,auVar100);
        auVar89._4_4_ = auVar74._4_4_ * auVar100._4_4_;
        auVar89._0_4_ = auVar74._0_4_ * auVar100._0_4_;
        auVar89._8_4_ = auVar74._8_4_ * auVar100._8_4_;
        auVar89._12_4_ = auVar74._12_4_ * auVar100._12_4_;
        auVar89._16_4_ = auVar100._16_4_ * 0.0;
        auVar89._20_4_ = auVar100._20_4_ * 0.0;
        auVar89._24_4_ = auVar100._24_4_ * 0.0;
        auVar89._28_4_ = auVar100._28_4_;
        auVar24 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar83),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar90,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar76));
        auVar92 = ZEXT1632(auVar84);
        uVar64 = vcmpps_avx512vl(auVar99,auVar92,2);
        bVar62 = (byte)uVar64;
        fVar72 = (float)((uint)(bVar62 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar30._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar122 = (float)((uint)bVar69 * auVar81._4_4_ | (uint)!bVar69 * auVar30._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar124 = (float)((uint)bVar69 * auVar81._8_4_ | (uint)!bVar69 * auVar30._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar127 = (float)((uint)bVar69 * auVar81._12_4_ | (uint)!bVar69 * auVar30._12_4_);
        auVar87 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar122,fVar72))));
        fVar73 = (float)((uint)(bVar62 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar25._0_4_);
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar123 = (float)((uint)bVar69 * auVar75._4_4_ | (uint)!bVar69 * auVar25._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar125 = (float)((uint)bVar69 * auVar75._8_4_ | (uint)!bVar69 * auVar25._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar128 = (float)((uint)bVar69 * auVar75._12_4_ | (uint)!bVar69 * auVar25._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar123,fVar73))));
        auVar104._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar32._0_4_)
        ;
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * auVar32._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * auVar32._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * auVar32._12_4_);
        fVar169 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar85._16_4_);
        auVar104._16_4_ = fVar169;
        fVar136 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar85._20_4_);
        auVar104._20_4_ = fVar136;
        fVar137 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar85._24_4_);
        auVar104._24_4_ = fVar137;
        iVar1 = (uint)(byte)(uVar64 >> 7) * auVar85._28_4_;
        auVar104._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar86);
        auVar105._0_4_ =
             (uint)(bVar62 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar75._0_4_;
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar75._4_4_;
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar75._8_4_;
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar75._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_;
        auVar105._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar22));
        auVar106._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar76._0_4_
                    );
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar76._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar76._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar76._12_4_);
        fVar138 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_);
        auVar106._16_4_ = fVar138;
        fVar178 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_);
        auVar106._20_4_ = fVar178;
        fVar172 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_);
        auVar106._24_4_ = fVar172;
        auVar106._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar23));
        auVar107._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar85._0_4_
                    );
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar85._4_4_);
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar85._8_4_);
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar85._12_4_);
        bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * auVar85._16_4_);
        bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * auVar85._20_4_);
        bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * auVar85._24_4_);
        bVar69 = SUB81(uVar64 >> 7,0);
        auVar107._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar85._28_4_;
        auVar108._0_4_ =
             (uint)(bVar62 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar86._0_4_;
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar69 * (int)auVar83._4_4_ | (uint)!bVar69 * auVar86._4_4_;
        bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar69 * (int)auVar83._8_4_ | (uint)!bVar69 * auVar86._8_4_;
        bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar69 * (int)auVar83._12_4_ | (uint)!bVar69 * auVar86._12_4_;
        auVar108._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar86._16_4_;
        auVar108._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar86._20_4_;
        auVar108._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar86._24_4_;
        auVar108._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar86._28_4_;
        bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._0_4_ =
             (uint)(bVar62 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar23._0_4_;
        bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar23._4_4_;
        bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar23._8_4_;
        bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar23._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar98._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar98._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar98._24_4_;
        iVar2 = (uint)(byte)(uVar64 >> 7) * auVar98._28_4_;
        auVar109._28_4_ = iVar2;
        auVar88 = vsubps_avx512vl(auVar108,auVar87);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar74._12_4_ |
                                                 (uint)!bVar19 * auVar22._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar74._8_4_ |
                                                          (uint)!bVar17 * auVar22._8_4_,
                                                          CONCAT44((uint)bVar69 * (int)auVar74._4_4_
                                                                   | (uint)!bVar69 * auVar22._4_4_,
                                                                   (uint)(bVar62 & 1) *
                                                                   (int)auVar74._0_4_ |
                                                                   (uint)!(bool)(bVar62 & 1) *
                                                                   auVar22._0_4_)))),auVar96);
        auVar98 = vsubps_avx(auVar109,auVar104);
        auVar97 = vsubps_avx(auVar87,auVar105);
        auVar85 = vsubps_avx(auVar96,auVar106);
        auVar86 = vsubps_avx(auVar104,auVar107);
        auVar90._4_4_ = auVar98._4_4_ * fVar122;
        auVar90._0_4_ = auVar98._0_4_ * fVar72;
        auVar90._8_4_ = auVar98._8_4_ * fVar124;
        auVar90._12_4_ = auVar98._12_4_ * fVar127;
        auVar90._16_4_ = auVar98._16_4_ * 0.0;
        auVar90._20_4_ = auVar98._20_4_ * 0.0;
        auVar90._24_4_ = auVar98._24_4_ * 0.0;
        auVar90._28_4_ = iVar2;
        auVar81 = vfmsub231ps_fma(auVar90,auVar104,auVar88);
        auVar91._4_4_ = fVar123 * auVar88._4_4_;
        auVar91._0_4_ = fVar73 * auVar88._0_4_;
        auVar91._8_4_ = fVar125 * auVar88._8_4_;
        auVar91._12_4_ = fVar128 * auVar88._12_4_;
        auVar91._16_4_ = auVar88._16_4_ * 0.0;
        auVar91._20_4_ = auVar88._20_4_ * 0.0;
        auVar91._24_4_ = auVar88._24_4_ * 0.0;
        auVar91._28_4_ = auVar99._28_4_;
        auVar75 = vfmsub231ps_fma(auVar91,auVar87,auVar100);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar92,ZEXT1632(auVar81));
        auVar161._0_4_ = auVar100._0_4_ * auVar104._0_4_;
        auVar161._4_4_ = auVar100._4_4_ * auVar104._4_4_;
        auVar161._8_4_ = auVar100._8_4_ * auVar104._8_4_;
        auVar161._12_4_ = auVar100._12_4_ * auVar104._12_4_;
        auVar161._16_4_ = auVar100._16_4_ * fVar169;
        auVar161._20_4_ = auVar100._20_4_ * fVar136;
        auVar161._24_4_ = auVar100._24_4_ * fVar137;
        auVar161._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar161,auVar96,auVar98);
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar81));
        auVar99 = vmulps_avx512vl(auVar86,auVar105);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar107);
        auVar95._4_4_ = auVar85._4_4_ * auVar107._4_4_;
        auVar95._0_4_ = auVar85._0_4_ * auVar107._0_4_;
        auVar95._8_4_ = auVar85._8_4_ * auVar107._8_4_;
        auVar95._12_4_ = auVar85._12_4_ * auVar107._12_4_;
        auVar95._16_4_ = auVar85._16_4_ * auVar107._16_4_;
        auVar95._20_4_ = auVar85._20_4_ * auVar107._20_4_;
        auVar95._24_4_ = auVar85._24_4_ * auVar107._24_4_;
        auVar95._28_4_ = auVar107._28_4_;
        auVar81 = vfmsub231ps_fma(auVar95,auVar106,auVar86);
        auVar162._0_4_ = auVar106._0_4_ * auVar97._0_4_;
        auVar162._4_4_ = auVar106._4_4_ * auVar97._4_4_;
        auVar162._8_4_ = auVar106._8_4_ * auVar97._8_4_;
        auVar162._12_4_ = auVar106._12_4_ * auVar97._12_4_;
        auVar162._16_4_ = fVar138 * auVar97._16_4_;
        auVar162._20_4_ = fVar178 * auVar97._20_4_;
        auVar162._24_4_ = fVar172 * auVar97._24_4_;
        auVar162._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar162,auVar85,auVar105);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar92,auVar99);
        auVar90 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar81));
        auVar99 = vmaxps_avx(auVar89,auVar90);
        uVar139 = vcmpps_avx512vl(auVar99,auVar92,2);
        bVar71 = bVar71 & (byte)uVar139;
        auVar194 = ZEXT3264(local_3c0);
        auVar192 = ZEXT3264(local_340);
        auVar193 = ZEXT3264(local_3e0);
        auVar199 = ZEXT3264(local_360);
        auVar198 = ZEXT3264(local_400);
        auVar196 = ZEXT3264(local_420);
        auVar195 = ZEXT3264(local_3a0);
        if (bVar71 == 0) {
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar190 = ZEXT3264(auVar99);
        }
        else {
          auVar39._4_4_ = auVar86._4_4_ * auVar100._4_4_;
          auVar39._0_4_ = auVar86._0_4_ * auVar100._0_4_;
          auVar39._8_4_ = auVar86._8_4_ * auVar100._8_4_;
          auVar39._12_4_ = auVar86._12_4_ * auVar100._12_4_;
          auVar39._16_4_ = auVar86._16_4_ * auVar100._16_4_;
          auVar39._20_4_ = auVar86._20_4_ * auVar100._20_4_;
          auVar39._24_4_ = auVar86._24_4_ * auVar100._24_4_;
          auVar39._28_4_ = auVar99._28_4_;
          auVar22 = vfmsub231ps_fma(auVar39,auVar85,auVar98);
          auVar40._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar40._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar40._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar40._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar40._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar40._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar40._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar40._28_4_ = auVar98._28_4_;
          auVar75 = vfmsub231ps_fma(auVar40,auVar88,auVar86);
          auVar41._4_4_ = auVar85._4_4_ * auVar88._4_4_;
          auVar41._0_4_ = auVar85._0_4_ * auVar88._0_4_;
          auVar41._8_4_ = auVar85._8_4_ * auVar88._8_4_;
          auVar41._12_4_ = auVar85._12_4_ * auVar88._12_4_;
          auVar41._16_4_ = auVar85._16_4_ * auVar88._16_4_;
          auVar41._20_4_ = auVar85._20_4_ * auVar88._20_4_;
          auVar41._24_4_ = auVar85._24_4_ * auVar88._24_4_;
          auVar41._28_4_ = auVar85._28_4_;
          auVar23 = vfmsub231ps_fma(auVar41,auVar97,auVar100);
          auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar23));
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar22),auVar92);
          auVar99 = vrcp14ps_avx512vl(auVar100);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar190 = ZEXT3264(auVar98);
          auVar97 = vfnmadd213ps_avx512vl(auVar99,auVar100,auVar98);
          auVar81 = vfmadd132ps_fma(auVar97,auVar99,auVar99);
          auVar42._4_4_ = auVar23._4_4_ * auVar104._4_4_;
          auVar42._0_4_ = auVar23._0_4_ * auVar104._0_4_;
          auVar42._8_4_ = auVar23._8_4_ * auVar104._8_4_;
          auVar42._12_4_ = auVar23._12_4_ * auVar104._12_4_;
          auVar42._16_4_ = fVar169 * 0.0;
          auVar42._20_4_ = fVar136 * 0.0;
          auVar42._24_4_ = fVar137 * 0.0;
          auVar42._28_4_ = iVar1;
          auVar75 = vfmadd231ps_fma(auVar42,auVar96,ZEXT1632(auVar75));
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar87,ZEXT1632(auVar22));
          fVar136 = auVar81._0_4_;
          fVar137 = auVar81._4_4_;
          fVar138 = auVar81._8_4_;
          fVar178 = auVar81._12_4_;
          local_200 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar178,
                                         CONCAT48(auVar75._8_4_ * fVar138,
                                                  CONCAT44(auVar75._4_4_ * fVar137,
                                                           auVar75._0_4_ * fVar136))));
          auVar175._8_4_ = 3;
          auVar175._0_8_ = 0x300000003;
          auVar175._12_4_ = 3;
          auVar175._16_4_ = 3;
          auVar175._20_4_ = 3;
          auVar175._24_4_ = 3;
          auVar175._28_4_ = 3;
          auVar99 = vpermps_avx2(auVar175,ZEXT1632((undefined1  [16])aVar4));
          uVar139 = vcmpps_avx512vl(auVar99,local_200,2);
          fVar169 = local_518->tfar;
          auVar34._4_4_ = fVar169;
          auVar34._0_4_ = fVar169;
          auVar34._8_4_ = fVar169;
          auVar34._12_4_ = fVar169;
          auVar34._16_4_ = fVar169;
          auVar34._20_4_ = fVar169;
          auVar34._24_4_ = fVar169;
          auVar34._28_4_ = fVar169;
          uVar28 = vcmpps_avx512vl(local_200,auVar34,2);
          bVar71 = (byte)uVar139 & (byte)uVar28 & bVar71;
          if (bVar71 != 0) {
            uVar139 = vcmpps_avx512vl(auVar100,auVar92,4);
            bVar71 = bVar71 & (byte)uVar139;
            if (bVar71 != 0) {
              fVar169 = auVar89._0_4_ * fVar136;
              fVar172 = auVar89._4_4_ * fVar137;
              auVar43._4_4_ = fVar172;
              auVar43._0_4_ = fVar169;
              fVar72 = auVar89._8_4_ * fVar138;
              auVar43._8_4_ = fVar72;
              fVar73 = auVar89._12_4_ * fVar178;
              auVar43._12_4_ = fVar73;
              fVar122 = auVar89._16_4_ * 0.0;
              auVar43._16_4_ = fVar122;
              fVar123 = auVar89._20_4_ * 0.0;
              auVar43._20_4_ = fVar123;
              fVar124 = auVar89._24_4_ * 0.0;
              auVar43._24_4_ = fVar124;
              auVar43._28_4_ = auVar100._28_4_;
              auVar99 = vsubps_avx512vl(auVar98,auVar43);
              local_240._0_4_ =
                   (float)((uint)(bVar62 & 1) * (int)fVar169 |
                          (uint)!(bool)(bVar62 & 1) * auVar99._0_4_);
              bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
              local_240._4_4_ = (float)((uint)bVar69 * (int)fVar172 | (uint)!bVar69 * auVar99._4_4_)
              ;
              bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
              local_240._8_4_ = (float)((uint)bVar69 * (int)fVar72 | (uint)!bVar69 * auVar99._8_4_);
              bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
              local_240._12_4_ =
                   (float)((uint)bVar69 * (int)fVar73 | (uint)!bVar69 * auVar99._12_4_);
              bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
              local_240._16_4_ =
                   (float)((uint)bVar69 * (int)fVar122 | (uint)!bVar69 * auVar99._16_4_);
              bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
              local_240._20_4_ =
                   (float)((uint)bVar69 * (int)fVar123 | (uint)!bVar69 * auVar99._20_4_);
              bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
              local_240._24_4_ =
                   (float)((uint)bVar69 * (int)fVar124 | (uint)!bVar69 * auVar99._24_4_);
              bVar69 = SUB81(uVar64 >> 7,0);
              local_240._28_4_ =
                   (float)((uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar99._28_4_);
              auVar99 = vsubps_avx(ZEXT1632(auVar77),auVar93);
              auVar81 = vfmadd213ps_fma(auVar99,local_240,auVar93);
              fVar169 = local_508->depth_scale;
              auVar93._4_4_ = fVar169;
              auVar93._0_4_ = fVar169;
              auVar93._8_4_ = fVar169;
              auVar93._12_4_ = fVar169;
              auVar93._16_4_ = fVar169;
              auVar93._20_4_ = fVar169;
              auVar93._24_4_ = fVar169;
              auVar93._28_4_ = fVar169;
              auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                           CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                    CONCAT44(auVar81._4_4_ +
                                                                             auVar81._4_4_,
                                                                             auVar81._0_4_ +
                                                                             auVar81._0_4_)))),
                                        auVar93);
              uVar139 = vcmpps_avx512vl(local_200,auVar99,6);
              if (((byte)uVar139 & bVar71) != 0) {
                auVar7._0_4_ = local_518->tfar;
                auVar7._4_4_ = local_518->mask;
                auVar7._8_4_ = local_518->id;
                auVar7._12_4_ = local_518->flags;
                uVar63 = vextractps_avx(auVar7,1);
                auVar157._0_4_ = auVar90._0_4_ * fVar136;
                auVar157._4_4_ = auVar90._4_4_ * fVar137;
                auVar157._8_4_ = auVar90._8_4_ * fVar138;
                auVar157._12_4_ = auVar90._12_4_ * fVar178;
                auVar157._16_4_ = auVar90._16_4_ * 0.0;
                auVar157._20_4_ = auVar90._20_4_ * 0.0;
                auVar157._24_4_ = auVar90._24_4_ * 0.0;
                auVar157._28_4_ = 0;
                auVar99 = vsubps_avx512vl(auVar98,auVar157);
                auVar110._0_4_ =
                     (uint)(bVar62 & 1) * (int)auVar157._0_4_ |
                     (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
                bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar110._4_4_ = (uint)bVar69 * (int)auVar157._4_4_ | (uint)!bVar69 * auVar99._4_4_;
                bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar110._8_4_ = (uint)bVar69 * (int)auVar157._8_4_ | (uint)!bVar69 * auVar99._8_4_;
                bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar69 * (int)auVar157._12_4_ | (uint)!bVar69 * auVar99._12_4_;
                bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar69 * (int)auVar157._16_4_ | (uint)!bVar69 * auVar99._16_4_;
                bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar69 * (int)auVar157._20_4_ | (uint)!bVar69 * auVar99._20_4_;
                bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar69 * (int)auVar157._24_4_ | (uint)!bVar69 * auVar99._24_4_;
                auVar110._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar99._28_4_;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_220 = vfmsub132ps_avx512vl(auVar110,auVar98,auVar35);
                local_1e0 = 0;
                local_1dc = iVar10;
                local_1d0 = local_460._0_8_;
                uStack_1c8 = local_460._8_8_;
                local_1c0 = local_470._0_8_;
                uStack_1b8 = local_470._8_8_;
                local_1b0 = local_480._0_8_;
                uStack_1a8 = local_480._8_8_;
                if ((pGVar11->mask & uVar63) != 0) {
                  if ((local_528->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar69 = true, local_480 = auVar26, local_470 = auVar27, local_460 = auVar31,
                     pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar169 = 1.0 / (float)local_2c0._0_4_;
                    local_180[0] = fVar169 * (local_240._0_4_ + 0.0);
                    local_180[1] = fVar169 * (local_240._4_4_ + 1.0);
                    local_180[2] = fVar169 * (local_240._8_4_ + 2.0);
                    local_180[3] = fVar169 * (local_240._12_4_ + 3.0);
                    fStack_170 = fVar169 * (local_240._16_4_ + 4.0);
                    fStack_16c = fVar169 * (local_240._20_4_ + 5.0);
                    fStack_168 = fVar169 * (local_240._24_4_ + 6.0);
                    fStack_164 = local_240._28_4_ + 7.0;
                    local_160 = local_220;
                    local_140 = local_200;
                    lVar68 = 0;
                    uVar65 = (ulong)((byte)uVar139 & bVar71);
                    for (uVar64 = uVar65; (uVar64 & 1) == 0;
                        uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                      lVar68 = lVar68 + 1;
                    }
                    local_300._0_16_ = auVar82;
                    local_490 = auVar7;
                    local_480 = auVar26;
                    local_470 = auVar27;
                    local_460 = auVar31;
                    do {
                      auVar75 = auVar191._0_16_;
                      local_4c4 = local_180[lVar68];
                      local_4c0 = *(undefined4 *)(local_160 + lVar68 * 4);
                      local_280._0_8_ = lVar68;
                      local_518->tfar = *(float *)(local_140 + lVar68 * 4);
                      local_500.context = local_528->user;
                      fVar136 = 1.0 - local_4c4;
                      fVar169 = fVar136 * fVar136 * -3.0;
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                                ZEXT416((uint)(local_4c4 * fVar136)),
                                                ZEXT416(0xc0000000));
                      auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar136)),
                                                ZEXT416((uint)(local_4c4 * local_4c4)),
                                                ZEXT416(0x40000000));
                      fVar136 = auVar82._0_4_ * 3.0;
                      fVar137 = auVar81._0_4_ * 3.0;
                      fVar138 = local_4c4 * local_4c4 * 3.0;
                      auVar167._0_4_ = fVar138 * (float)local_310._0_4_;
                      auVar167._4_4_ = fVar138 * (float)local_310._4_4_;
                      auVar167._8_4_ = fVar138 * fStack_308;
                      auVar167._12_4_ = fVar138 * fStack_304;
                      auVar151._4_4_ = fVar137;
                      auVar151._0_4_ = fVar137;
                      auVar151._8_4_ = fVar137;
                      auVar151._12_4_ = fVar137;
                      auVar82 = vfmadd132ps_fma(auVar151,auVar167,local_480);
                      auVar155._4_4_ = fVar136;
                      auVar155._0_4_ = fVar136;
                      auVar155._8_4_ = fVar136;
                      auVar155._12_4_ = fVar136;
                      auVar82 = vfmadd132ps_fma(auVar155,auVar82,local_470);
                      auVar152._4_4_ = fVar169;
                      auVar152._0_4_ = fVar169;
                      auVar152._8_4_ = fVar169;
                      auVar152._12_4_ = fVar169;
                      auVar82 = vfmadd132ps_fma(auVar152,auVar82,local_460);
                      local_4d0 = vmovlps_avx(auVar82);
                      local_4c8 = vextractps_avx(auVar82,2);
                      local_4bc = (int)local_498;
                      local_4b8 = (int)local_510;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_52c = -1;
                      local_500.valid = &local_52c;
                      local_500.geometryUserPtr = pGVar11->userPtr;
                      local_500.ray = (RTCRayN *)local_518;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar11->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        p_Var15 = local_528->args->filter;
                        if ((p_Var15 == (RTCFilterFunctionN)0x0) ||
                           ((((local_528->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                              == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var15)(&local_500), *local_500.valid != 0)))) {
                          bVar69 = true;
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar190 = ZEXT3264(auVar99);
                          auVar82 = vxorps_avx512vl(auVar75,auVar75);
                          auVar191 = ZEXT1664(auVar82);
                          auVar194 = ZEXT3264(local_3c0);
                          auVar192 = ZEXT3264(local_340);
                          auVar193 = ZEXT3264(local_3e0);
                          auVar199 = ZEXT3264(local_360);
                          auVar198 = ZEXT3264(local_400);
                          auVar196 = ZEXT3264(local_420);
                          auVar197 = ZEXT3264(local_380);
                          auVar195 = ZEXT3264(local_3a0);
                          auVar82 = local_300._0_16_;
                          break;
                        }
                      }
                      local_518->tfar = (float)local_490._0_4_;
                      bVar69 = false;
                      lVar68 = 0;
                      uVar65 = uVar65 ^ 1L << (local_280._0_8_ & 0x3f);
                      for (uVar64 = uVar65; (uVar64 & 1) == 0;
                          uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                        lVar68 = lVar68 + 1;
                      }
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar190 = ZEXT3264(auVar99);
                      auVar82 = vxorps_avx512vl(auVar75,auVar75);
                      auVar191 = ZEXT1664(auVar82);
                      auVar194 = ZEXT3264(local_3c0);
                      auVar192 = ZEXT3264(local_340);
                      auVar193 = ZEXT3264(local_3e0);
                      auVar199 = ZEXT3264(local_360);
                      auVar198 = ZEXT3264(local_400);
                      auVar196 = ZEXT3264(local_420);
                      auVar197 = ZEXT3264(local_380);
                      auVar195 = ZEXT3264(local_3a0);
                      auVar82 = local_300._0_16_;
                    } while (uVar65 != 0);
                  }
                  goto LAB_01beb015;
                }
              }
            }
            bVar69 = false;
            local_480 = auVar26;
            local_470 = auVar27;
            local_460 = auVar31;
            goto LAB_01beb015;
          }
        }
        bVar69 = false;
        local_480 = auVar26;
        local_470 = auVar27;
        local_460 = auVar31;
      }
LAB_01beb015:
      context = local_528;
      ray = local_518;
      if (8 < iVar10) {
        local_280 = vpbroadcastd_avx512vl();
        local_300 = vbroadcastss_avx512vl(auVar82);
        auVar135._8_4_ = 3;
        auVar135._0_8_ = 0x300000003;
        auVar135._12_4_ = 3;
        auVar135._16_4_ = 3;
        auVar135._20_4_ = 3;
        auVar135._24_4_ = 3;
        auVar135._28_4_ = 3;
        local_2a0 = vpermps_avx2(auVar135,local_2a0);
        local_2c0._4_4_ = 1.0 / (float)local_2c0._0_4_;
        local_2c0._0_4_ = local_2c0._4_4_;
        fStack_2b8 = (float)local_2c0._4_4_;
        fStack_2b4 = (float)local_2c0._4_4_;
        fStack_2b0 = (float)local_2c0._4_4_;
        fStack_2ac = (float)local_2c0._4_4_;
        fStack_2a8 = (float)local_2c0._4_4_;
        fStack_2a4 = (float)local_2c0._4_4_;
        lVar68 = 8;
        do {
          auVar99 = vpbroadcastd_avx512vl();
          auVar85 = vpor_avx2(auVar99,_DAT_01fe9900);
          uVar28 = vpcmpd_avx512vl(auVar85,local_280,1);
          auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar68 * 4 + lVar29);
          auVar100 = *(undefined1 (*) [32])(lVar29 + 0x21aa768 + lVar68 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar29 + 0x21aabec + lVar68 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar29 + 0x21ab070 + lVar68 * 4);
          local_380 = auVar197._0_32_;
          auVar86 = vmulps_avx512vl(local_380,auVar97);
          local_3a0 = auVar195._0_32_;
          auVar87 = vmulps_avx512vl(local_3a0,auVar97);
          auVar44._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
          auVar44._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
          auVar44._8_4_ = auVar97._8_4_ * fStack_d8;
          auVar44._12_4_ = auVar97._12_4_ * fStack_d4;
          auVar44._16_4_ = auVar97._16_4_ * fStack_d0;
          auVar44._20_4_ = auVar97._20_4_ * fStack_cc;
          auVar44._24_4_ = auVar97._24_4_ * fStack_c8;
          auVar44._28_4_ = auVar85._28_4_;
          auVar104 = auVar198._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar86,auVar98,auVar104);
          auVar103 = auVar196._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar87,auVar98,auVar103);
          auVar87 = vfmadd231ps_avx512vl(auVar44,auVar98,local_c0);
          auVar101 = auVar193._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar101);
          local_360 = auVar199._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_360);
          auVar82 = vfmadd231ps_fma(auVar87,auVar100,local_a0);
          auVar102 = auVar194._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar102);
          local_340 = auVar192._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar86,auVar99,local_340);
          auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar68 * 4 + lVar29);
          auVar86 = *(undefined1 (*) [32])(lVar29 + 0x21acb88 + lVar68 * 4);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar99,local_80);
          auVar87 = *(undefined1 (*) [32])(lVar29 + 0x21ad00c + lVar68 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar29 + 0x21ad490 + lVar68 * 4);
          auVar88 = vmulps_avx512vl(local_380,auVar96);
          auVar89 = vmulps_avx512vl(local_3a0,auVar96);
          auVar45._4_4_ = auVar96._4_4_ * (float)local_e0._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * (float)local_e0._0_4_;
          auVar45._8_4_ = auVar96._8_4_ * fStack_d8;
          auVar45._12_4_ = auVar96._12_4_ * fStack_d4;
          auVar45._16_4_ = auVar96._16_4_ * fStack_d0;
          auVar45._20_4_ = auVar96._20_4_ * fStack_cc;
          auVar45._24_4_ = auVar96._24_4_ * fStack_c8;
          auVar45._28_4_ = uStack_c4;
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar104);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar103);
          auVar92 = vfmadd231ps_avx512vl(auVar45,auVar87,local_c0);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar101);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_360);
          auVar81 = vfmadd231ps_fma(auVar92,auVar86,local_a0);
          auVar92 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar102);
          auVar93 = vfmadd231ps_avx512vl(auVar89,auVar85,local_340);
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar85,local_80);
          auVar94 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar81));
          auVar88 = vsubps_avx(auVar92,auVar90);
          auVar89 = vsubps_avx(auVar93,auVar91);
          auVar95 = vmulps_avx512vl(auVar91,auVar88);
          auVar111 = vmulps_avx512vl(auVar90,auVar89);
          auVar95 = vsubps_avx512vl(auVar95,auVar111);
          auVar111 = vmulps_avx512vl(auVar89,auVar89);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar88,auVar88);
          auVar94 = vmulps_avx512vl(auVar94,auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar111);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          uVar139 = vcmpps_avx512vl(auVar95,auVar94,2);
          bVar71 = (byte)uVar28 & (byte)uVar139;
          if (bVar71 != 0) {
            auVar96 = vmulps_avx512vl(local_440,auVar96);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_120,auVar96);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_100,auVar87);
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_2e0,auVar86);
            auVar97 = vmulps_avx512vl(local_440,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar97);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_100,auVar98);
            auVar86 = vfmadd213ps_avx512vl(auVar99,local_2e0,auVar100);
            auVar99 = *(undefined1 (*) [32])(lVar29 + 0x21ab4f4 + lVar68 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar29 + 0x21ab978 + lVar68 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar29 + 0x21abdfc + lVar68 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar29 + 0x21ac280 + lVar68 * 4);
            auVar87 = vmulps_avx512vl(local_380,auVar97);
            auVar96 = vmulps_avx512vl(local_3a0,auVar97);
            auVar97 = vmulps_avx512vl(local_440,auVar97);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar98,auVar104);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar103);
            auVar98 = vfmadd231ps_avx512vl(auVar97,local_120,auVar98);
            auVar97 = vfmadd231ps_avx512vl(auVar87,auVar100,auVar101);
            auVar87 = vfmadd231ps_avx512vl(auVar96,auVar100,local_360);
            auVar100 = vfmadd231ps_avx512vl(auVar98,local_100,auVar100);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar102);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_340);
            auVar96 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar29 + 0x21ad914 + lVar68 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar29 + 0x21ae21c + lVar68 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar29 + 0x21ae6a0 + lVar68 * 4);
            auVar94 = vmulps_avx512vl(local_380,auVar98);
            auVar95 = vmulps_avx512vl(local_3a0,auVar98);
            auVar98 = vmulps_avx512vl(local_440,auVar98);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar104);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar103);
            auVar98 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar29 + 0x21add98 + lVar68 * 4);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar101);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_360);
            auVar100 = vfmadd231ps_avx512vl(auVar98,local_100,auVar100);
            auVar98 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar102);
            auVar94 = vfmadd231ps_avx512vl(auVar95,auVar99,local_340);
            auVar100 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar99);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar97,auVar95);
            vandps_avx512vl(auVar87,auVar95);
            auVar99 = vmaxps_avx(auVar95,auVar95);
            vandps_avx512vl(auVar96,auVar95);
            auVar99 = vmaxps_avx(auVar99,auVar95);
            uVar64 = vcmpps_avx512vl(auVar99,local_300,1);
            bVar16 = (bool)((byte)uVar64 & 1);
            auVar112._0_4_ = (float)((uint)bVar16 * auVar88._0_4_ | (uint)!bVar16 * auVar97._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar97._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar97._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar97._12_4_);
            bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * auVar97._16_4_);
            bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar16 * auVar88._20_4_ | (uint)!bVar16 * auVar97._20_4_);
            bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar16 * auVar88._24_4_ | (uint)!bVar16 * auVar97._24_4_);
            bVar16 = SUB81(uVar64 >> 7,0);
            auVar112._28_4_ = (uint)bVar16 * auVar88._28_4_ | (uint)!bVar16 * auVar97._28_4_;
            bVar16 = (bool)((byte)uVar64 & 1);
            auVar113._0_4_ = (float)((uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar87._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar87._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar87._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar87._12_4_);
            bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar16 * auVar89._16_4_ | (uint)!bVar16 * auVar87._16_4_);
            bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar16 * auVar89._20_4_ | (uint)!bVar16 * auVar87._20_4_);
            bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar16 * auVar89._24_4_ | (uint)!bVar16 * auVar87._24_4_);
            bVar16 = SUB81(uVar64 >> 7,0);
            auVar113._28_4_ = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * auVar87._28_4_;
            vandps_avx512vl(auVar98,auVar95);
            vandps_avx512vl(auVar94,auVar95);
            auVar99 = vmaxps_avx(auVar113,auVar113);
            vandps_avx512vl(auVar100,auVar95);
            auVar99 = vmaxps_avx(auVar99,auVar113);
            uVar64 = vcmpps_avx512vl(auVar99,local_300,1);
            bVar16 = (bool)((byte)uVar64 & 1);
            auVar114._0_4_ = (uint)bVar16 * auVar88._0_4_ | (uint)!bVar16 * auVar98._0_4_;
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar98._4_4_;
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar98._8_4_;
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar98._12_4_;
            bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar114._16_4_ = (uint)bVar16 * auVar88._16_4_ | (uint)!bVar16 * auVar98._16_4_;
            bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar114._20_4_ = (uint)bVar16 * auVar88._20_4_ | (uint)!bVar16 * auVar98._20_4_;
            bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar114._24_4_ = (uint)bVar16 * auVar88._24_4_ | (uint)!bVar16 * auVar98._24_4_;
            bVar16 = SUB81(uVar64 >> 7,0);
            auVar114._28_4_ = (uint)bVar16 * auVar88._28_4_ | (uint)!bVar16 * auVar98._28_4_;
            bVar16 = (bool)((byte)uVar64 & 1);
            auVar115._0_4_ = (float)((uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar94._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar94._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar94._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar94._12_4_);
            bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar16 * auVar89._16_4_ | (uint)!bVar16 * auVar94._16_4_);
            bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar16 * auVar89._20_4_ | (uint)!bVar16 * auVar94._20_4_);
            bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar16 * auVar89._24_4_ | (uint)!bVar16 * auVar94._24_4_);
            bVar16 = SUB81(uVar64 >> 7,0);
            auVar115._28_4_ = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * auVar94._28_4_;
            auVar180._8_4_ = 0x80000000;
            auVar180._0_8_ = 0x8000000080000000;
            auVar180._12_4_ = 0x80000000;
            auVar180._16_4_ = 0x80000000;
            auVar180._20_4_ = 0x80000000;
            auVar180._24_4_ = 0x80000000;
            auVar180._28_4_ = 0x80000000;
            auVar99 = vxorps_avx512vl(auVar114,auVar180);
            auVar94 = auVar191._0_32_;
            auVar100 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar94);
            auVar75 = vfmadd231ps_fma(auVar100,auVar113,auVar113);
            auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
            auVar189._8_4_ = 0xbf000000;
            auVar189._0_8_ = 0xbf000000bf000000;
            auVar189._12_4_ = 0xbf000000;
            auVar189._16_4_ = 0xbf000000;
            auVar189._20_4_ = 0xbf000000;
            auVar189._24_4_ = 0xbf000000;
            auVar189._28_4_ = 0xbf000000;
            fVar169 = auVar100._0_4_;
            fVar136 = auVar100._4_4_;
            fVar137 = auVar100._8_4_;
            fVar138 = auVar100._12_4_;
            fVar178 = auVar100._16_4_;
            fVar172 = auVar100._20_4_;
            fVar72 = auVar100._24_4_;
            auVar46._4_4_ = fVar136 * fVar136 * fVar136 * auVar75._4_4_ * -0.5;
            auVar46._0_4_ = fVar169 * fVar169 * fVar169 * auVar75._0_4_ * -0.5;
            auVar46._8_4_ = fVar137 * fVar137 * fVar137 * auVar75._8_4_ * -0.5;
            auVar46._12_4_ = fVar138 * fVar138 * fVar138 * auVar75._12_4_ * -0.5;
            auVar46._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
            auVar46._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar46._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
            auVar46._28_4_ = auVar113._28_4_;
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar100 = vfmadd231ps_avx512vl(auVar46,auVar98,auVar100);
            auVar47._4_4_ = auVar113._4_4_ * auVar100._4_4_;
            auVar47._0_4_ = auVar113._0_4_ * auVar100._0_4_;
            auVar47._8_4_ = auVar113._8_4_ * auVar100._8_4_;
            auVar47._12_4_ = auVar113._12_4_ * auVar100._12_4_;
            auVar47._16_4_ = auVar113._16_4_ * auVar100._16_4_;
            auVar47._20_4_ = auVar113._20_4_ * auVar100._20_4_;
            auVar47._24_4_ = auVar113._24_4_ * auVar100._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
            auVar48._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
            auVar48._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
            auVar48._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
            auVar48._16_4_ = auVar100._16_4_ * -auVar112._16_4_;
            auVar48._20_4_ = auVar100._20_4_ * -auVar112._20_4_;
            auVar48._24_4_ = auVar100._24_4_ * -auVar112._24_4_;
            auVar48._28_4_ = auVar113._28_4_;
            auVar97 = vmulps_avx512vl(auVar100,auVar94);
            auVar100 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar94);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,auVar115);
            auVar87 = vrsqrt14ps_avx512vl(auVar100);
            auVar100 = vmulps_avx512vl(auVar100,auVar189);
            fVar169 = auVar87._0_4_;
            fVar136 = auVar87._4_4_;
            fVar137 = auVar87._8_4_;
            fVar138 = auVar87._12_4_;
            fVar178 = auVar87._16_4_;
            fVar172 = auVar87._20_4_;
            fVar72 = auVar87._24_4_;
            auVar49._4_4_ = fVar136 * fVar136 * fVar136 * auVar100._4_4_;
            auVar49._0_4_ = fVar169 * fVar169 * fVar169 * auVar100._0_4_;
            auVar49._8_4_ = fVar137 * fVar137 * fVar137 * auVar100._8_4_;
            auVar49._12_4_ = fVar138 * fVar138 * fVar138 * auVar100._12_4_;
            auVar49._16_4_ = fVar178 * fVar178 * fVar178 * auVar100._16_4_;
            auVar49._20_4_ = fVar172 * fVar172 * fVar172 * auVar100._20_4_;
            auVar49._24_4_ = fVar72 * fVar72 * fVar72 * auVar100._24_4_;
            auVar49._28_4_ = auVar100._28_4_;
            auVar100 = vfmadd231ps_avx512vl(auVar49,auVar98,auVar87);
            auVar50._4_4_ = auVar115._4_4_ * auVar100._4_4_;
            auVar50._0_4_ = auVar115._0_4_ * auVar100._0_4_;
            auVar50._8_4_ = auVar115._8_4_ * auVar100._8_4_;
            auVar50._12_4_ = auVar115._12_4_ * auVar100._12_4_;
            auVar50._16_4_ = auVar115._16_4_ * auVar100._16_4_;
            auVar50._20_4_ = auVar115._20_4_ * auVar100._20_4_;
            auVar50._24_4_ = auVar115._24_4_ * auVar100._24_4_;
            auVar50._28_4_ = auVar87._28_4_;
            auVar51._4_4_ = auVar100._4_4_ * auVar99._4_4_;
            auVar51._0_4_ = auVar100._0_4_ * auVar99._0_4_;
            auVar51._8_4_ = auVar100._8_4_ * auVar99._8_4_;
            auVar51._12_4_ = auVar100._12_4_ * auVar99._12_4_;
            auVar51._16_4_ = auVar100._16_4_ * auVar99._16_4_;
            auVar51._20_4_ = auVar100._20_4_ * auVar99._20_4_;
            auVar51._24_4_ = auVar100._24_4_ * auVar99._24_4_;
            auVar51._28_4_ = auVar99._28_4_;
            auVar99 = vmulps_avx512vl(auVar100,auVar94);
            auVar75 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar82),auVar90);
            auVar100 = ZEXT1632(auVar82);
            auVar22 = vfmadd213ps_fma(auVar48,auVar100,auVar91);
            auVar98 = vfmadd213ps_avx512vl(auVar97,auVar100,auVar86);
            auVar87 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar81),auVar92);
            auVar77 = vfnmadd213ps_fma(auVar47,auVar100,auVar90);
            auVar96 = ZEXT1632(auVar81);
            auVar23 = vfmadd213ps_fma(auVar51,auVar96,auVar93);
            auVar26 = vfnmadd213ps_fma(auVar48,auVar100,auVar91);
            auVar76 = vfmadd213ps_fma(auVar99,auVar96,auVar85);
            auVar91 = ZEXT1632(auVar82);
            auVar83 = vfnmadd231ps_fma(auVar86,auVar91,auVar97);
            auVar27 = vfnmadd213ps_fma(auVar50,auVar96,auVar92);
            auVar31 = vfnmadd213ps_fma(auVar51,auVar96,auVar93);
            auVar74 = vfnmadd231ps_fma(auVar85,ZEXT1632(auVar81),auVar99);
            auVar85 = vsubps_avx512vl(auVar87,ZEXT1632(auVar77));
            auVar99 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar26));
            auVar100 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar83));
            auVar52._4_4_ = auVar99._4_4_ * auVar83._4_4_;
            auVar52._0_4_ = auVar99._0_4_ * auVar83._0_4_;
            auVar52._8_4_ = auVar99._8_4_ * auVar83._8_4_;
            auVar52._12_4_ = auVar99._12_4_ * auVar83._12_4_;
            auVar52._16_4_ = auVar99._16_4_ * 0.0;
            auVar52._20_4_ = auVar99._20_4_ * 0.0;
            auVar52._24_4_ = auVar99._24_4_ * 0.0;
            auVar52._28_4_ = auVar97._28_4_;
            auVar82 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar26),auVar100);
            auVar53._4_4_ = auVar100._4_4_ * auVar77._4_4_;
            auVar53._0_4_ = auVar100._0_4_ * auVar77._0_4_;
            auVar53._8_4_ = auVar100._8_4_ * auVar77._8_4_;
            auVar53._12_4_ = auVar100._12_4_ * auVar77._12_4_;
            auVar53._16_4_ = auVar100._16_4_ * 0.0;
            auVar53._20_4_ = auVar100._20_4_ * 0.0;
            auVar53._24_4_ = auVar100._24_4_ * 0.0;
            auVar53._28_4_ = auVar100._28_4_;
            auVar24 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar83),auVar85);
            auVar54._4_4_ = auVar26._4_4_ * auVar85._4_4_;
            auVar54._0_4_ = auVar26._0_4_ * auVar85._0_4_;
            auVar54._8_4_ = auVar26._8_4_ * auVar85._8_4_;
            auVar54._12_4_ = auVar26._12_4_ * auVar85._12_4_;
            auVar54._16_4_ = auVar85._16_4_ * 0.0;
            auVar54._20_4_ = auVar85._20_4_ * 0.0;
            auVar54._24_4_ = auVar85._24_4_ * 0.0;
            auVar54._28_4_ = auVar85._28_4_;
            auVar25 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar77),auVar99);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar25),auVar94,ZEXT1632(auVar24));
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar82));
            uVar64 = vcmpps_avx512vl(auVar99,auVar94,2);
            bVar62 = (byte)uVar64;
            fVar123 = (float)((uint)(bVar62 & 1) * auVar75._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar27._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            fVar125 = (float)((uint)bVar16 * auVar75._4_4_ | (uint)!bVar16 * auVar27._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            fVar128 = (float)((uint)bVar16 * auVar75._8_4_ | (uint)!bVar16 * auVar27._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            fVar129 = (float)((uint)bVar16 * auVar75._12_4_ | (uint)!bVar16 * auVar27._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar125,fVar123))));
            fVar124 = (float)((uint)(bVar62 & 1) * auVar22._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar31._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            fVar127 = (float)((uint)bVar16 * auVar22._4_4_ | (uint)!bVar16 * auVar31._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            fVar126 = (float)((uint)bVar16 * auVar22._8_4_ | (uint)!bVar16 * auVar31._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            fVar130 = (float)((uint)bVar16 * auVar22._12_4_ | (uint)!bVar16 * auVar31._12_4_);
            auVar88 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar127,fVar124))));
            auVar116._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar74._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar74._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar74._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar74._12_4_);
            fVar137 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar98._16_4_);
            auVar116._16_4_ = fVar137;
            fVar136 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar98._20_4_);
            auVar116._20_4_ = fVar136;
            fVar169 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar98._24_4_);
            auVar116._24_4_ = fVar169;
            iVar1 = (uint)(byte)(uVar64 >> 7) * auVar98._28_4_;
            auVar116._28_4_ = iVar1;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar87);
            auVar117._0_4_ =
                 (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar82._0_4_;
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar82._4_4_;
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar82._8_4_;
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar82._12_4_;
            auVar117._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_;
            auVar117._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_;
            auVar117._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_;
            auVar117._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar26),ZEXT1632(auVar23));
            auVar118._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar75._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar75._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar75._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar75._12_4_);
            fVar172 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
            auVar118._16_4_ = fVar172;
            fVar138 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
            auVar118._20_4_ = fVar138;
            fVar178 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
            auVar118._24_4_ = fVar178;
            auVar118._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar76));
            auVar119._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar22._0_4_);
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar22._4_4_);
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar22._8_4_);
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar22._12_4_);
            fVar73 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
            auVar119._16_4_ = fVar73;
            fVar72 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
            auVar119._20_4_ = fVar72;
            fVar122 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
            auVar119._24_4_ = fVar122;
            iVar2 = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
            auVar119._28_4_ = iVar2;
            auVar120._0_4_ =
                 (uint)(bVar62 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar87._0_4_
            ;
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar16 * (int)auVar77._4_4_ | (uint)!bVar16 * auVar87._4_4_;
            bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar16 * (int)auVar77._8_4_ | (uint)!bVar16 * auVar87._8_4_;
            bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar16 * (int)auVar77._12_4_ | (uint)!bVar16 * auVar87._12_4_;
            auVar120._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar87._16_4_;
            auVar120._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar87._20_4_;
            auVar120._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar87._24_4_;
            auVar120._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar87._28_4_;
            bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar64 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar64 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar64 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar64 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar64 >> 3) & 1);
            auVar87 = vsubps_avx512vl(auVar120,auVar96);
            auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar26._12_4_ |
                                                     (uint)!bVar20 * auVar23._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar26._8_4_ |
                                                              (uint)!bVar19 * auVar23._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar26._4_4_ |
                                                                       (uint)!bVar16 * auVar23._4_4_
                                                                       ,(uint)(bVar62 & 1) *
                                                                        (int)auVar26._0_4_ |
                                                                        (uint)!(bool)(bVar62 & 1) *
                                                                        auVar23._0_4_)))),auVar88);
            auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar83._12_4_ |
                                                    (uint)!bVar21 * auVar76._12_4_,
                                                    CONCAT48((uint)bVar18 * (int)auVar83._8_4_ |
                                                             (uint)!bVar18 * auVar76._8_4_,
                                                             CONCAT44((uint)bVar17 *
                                                                      (int)auVar83._4_4_ |
                                                                      (uint)!bVar17 * auVar76._4_4_,
                                                                      (uint)(bVar62 & 1) *
                                                                      (int)auVar83._0_4_ |
                                                                      (uint)!(bool)(bVar62 & 1) *
                                                                      auVar76._0_4_)))),auVar116);
            auVar97 = vsubps_avx(auVar96,auVar117);
            auVar85 = vsubps_avx(auVar88,auVar118);
            auVar86 = vsubps_avx(auVar116,auVar119);
            auVar55._4_4_ = auVar98._4_4_ * fVar125;
            auVar55._0_4_ = auVar98._0_4_ * fVar123;
            auVar55._8_4_ = auVar98._8_4_ * fVar128;
            auVar55._12_4_ = auVar98._12_4_ * fVar129;
            auVar55._16_4_ = auVar98._16_4_ * 0.0;
            auVar55._20_4_ = auVar98._20_4_ * 0.0;
            auVar55._24_4_ = auVar98._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar55,auVar116,auVar87);
            auVar158._0_4_ = fVar124 * auVar87._0_4_;
            auVar158._4_4_ = fVar127 * auVar87._4_4_;
            auVar158._8_4_ = fVar126 * auVar87._8_4_;
            auVar158._12_4_ = fVar130 * auVar87._12_4_;
            auVar158._16_4_ = auVar87._16_4_ * 0.0;
            auVar158._20_4_ = auVar87._20_4_ * 0.0;
            auVar158._24_4_ = auVar87._24_4_ * 0.0;
            auVar158._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar158,auVar96,auVar100);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar94,ZEXT1632(auVar82));
            auVar163._0_4_ = auVar100._0_4_ * auVar116._0_4_;
            auVar163._4_4_ = auVar100._4_4_ * auVar116._4_4_;
            auVar163._8_4_ = auVar100._8_4_ * auVar116._8_4_;
            auVar163._12_4_ = auVar100._12_4_ * auVar116._12_4_;
            auVar163._16_4_ = auVar100._16_4_ * fVar137;
            auVar163._20_4_ = auVar100._20_4_ * fVar136;
            auVar163._24_4_ = auVar100._24_4_ * fVar169;
            auVar163._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar163,auVar88,auVar98);
            auVar89 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar82));
            auVar99 = vmulps_avx512vl(auVar86,auVar117);
            auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar119);
            auVar56._4_4_ = auVar85._4_4_ * auVar119._4_4_;
            auVar56._0_4_ = auVar85._0_4_ * auVar119._0_4_;
            auVar56._8_4_ = auVar85._8_4_ * auVar119._8_4_;
            auVar56._12_4_ = auVar85._12_4_ * auVar119._12_4_;
            auVar56._16_4_ = auVar85._16_4_ * fVar73;
            auVar56._20_4_ = auVar85._20_4_ * fVar72;
            auVar56._24_4_ = auVar85._24_4_ * fVar122;
            auVar56._28_4_ = iVar2;
            auVar82 = vfmsub231ps_fma(auVar56,auVar118,auVar86);
            auVar164._0_4_ = auVar118._0_4_ * auVar97._0_4_;
            auVar164._4_4_ = auVar118._4_4_ * auVar97._4_4_;
            auVar164._8_4_ = auVar118._8_4_ * auVar97._8_4_;
            auVar164._12_4_ = auVar118._12_4_ * auVar97._12_4_;
            auVar164._16_4_ = fVar172 * auVar97._16_4_;
            auVar164._20_4_ = fVar138 * auVar97._20_4_;
            auVar164._24_4_ = fVar178 * auVar97._24_4_;
            auVar164._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar164,auVar85,auVar117);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar94,auVar99);
            auVar90 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar82));
            auVar99 = vmaxps_avx(auVar89,auVar90);
            uVar139 = vcmpps_avx512vl(auVar99,auVar94,2);
            bVar71 = bVar71 & (byte)uVar139;
            if (bVar71 != 0) {
              auVar57._4_4_ = auVar86._4_4_ * auVar100._4_4_;
              auVar57._0_4_ = auVar86._0_4_ * auVar100._0_4_;
              auVar57._8_4_ = auVar86._8_4_ * auVar100._8_4_;
              auVar57._12_4_ = auVar86._12_4_ * auVar100._12_4_;
              auVar57._16_4_ = auVar86._16_4_ * auVar100._16_4_;
              auVar57._20_4_ = auVar86._20_4_ * auVar100._20_4_;
              auVar57._24_4_ = auVar86._24_4_ * auVar100._24_4_;
              auVar57._28_4_ = auVar99._28_4_;
              auVar22 = vfmsub231ps_fma(auVar57,auVar85,auVar98);
              auVar58._4_4_ = auVar98._4_4_ * auVar97._4_4_;
              auVar58._0_4_ = auVar98._0_4_ * auVar97._0_4_;
              auVar58._8_4_ = auVar98._8_4_ * auVar97._8_4_;
              auVar58._12_4_ = auVar98._12_4_ * auVar97._12_4_;
              auVar58._16_4_ = auVar98._16_4_ * auVar97._16_4_;
              auVar58._20_4_ = auVar98._20_4_ * auVar97._20_4_;
              auVar58._24_4_ = auVar98._24_4_ * auVar97._24_4_;
              auVar58._28_4_ = auVar98._28_4_;
              auVar75 = vfmsub231ps_fma(auVar58,auVar87,auVar86);
              auVar59._4_4_ = auVar85._4_4_ * auVar87._4_4_;
              auVar59._0_4_ = auVar85._0_4_ * auVar87._0_4_;
              auVar59._8_4_ = auVar85._8_4_ * auVar87._8_4_;
              auVar59._12_4_ = auVar85._12_4_ * auVar87._12_4_;
              auVar59._16_4_ = auVar85._16_4_ * auVar87._16_4_;
              auVar59._20_4_ = auVar85._20_4_ * auVar87._20_4_;
              auVar59._24_4_ = auVar85._24_4_ * auVar87._24_4_;
              auVar59._28_4_ = auVar85._28_4_;
              auVar23 = vfmsub231ps_fma(auVar59,auVar97,auVar100);
              auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar23));
              auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar22),auVar94);
              auVar100 = vrcp14ps_avx512vl(auVar99);
              auVar97 = auVar190._0_32_;
              auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar97);
              auVar82 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
              auVar60._4_4_ = auVar23._4_4_ * auVar116._4_4_;
              auVar60._0_4_ = auVar23._0_4_ * auVar116._0_4_;
              auVar60._8_4_ = auVar23._8_4_ * auVar116._8_4_;
              auVar60._12_4_ = auVar23._12_4_ * auVar116._12_4_;
              auVar60._16_4_ = fVar137 * 0.0;
              auVar60._20_4_ = fVar136 * 0.0;
              auVar60._24_4_ = fVar169 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar75 = vfmadd231ps_fma(auVar60,auVar88,ZEXT1632(auVar75));
              auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar96,ZEXT1632(auVar22));
              fVar136 = auVar82._0_4_;
              fVar137 = auVar82._4_4_;
              fVar138 = auVar82._8_4_;
              fVar178 = auVar82._12_4_;
              local_200 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar178,
                                             CONCAT48(auVar75._8_4_ * fVar138,
                                                      CONCAT44(auVar75._4_4_ * fVar137,
                                                               auVar75._0_4_ * fVar136))));
              uVar139 = vcmpps_avx512vl(local_200,local_2a0,0xd);
              fVar169 = ray->tfar;
              auVar36._4_4_ = fVar169;
              auVar36._0_4_ = fVar169;
              auVar36._8_4_ = fVar169;
              auVar36._12_4_ = fVar169;
              auVar36._16_4_ = fVar169;
              auVar36._20_4_ = fVar169;
              auVar36._24_4_ = fVar169;
              auVar36._28_4_ = fVar169;
              uVar28 = vcmpps_avx512vl(local_200,auVar36,2);
              bVar71 = (byte)uVar139 & (byte)uVar28 & bVar71;
              if (bVar71 != 0) {
                uVar139 = vcmpps_avx512vl(auVar99,auVar94,4);
                bVar71 = bVar71 & (byte)uVar139;
                if (bVar71 != 0) {
                  fVar169 = auVar89._0_4_ * fVar136;
                  fVar172 = auVar89._4_4_ * fVar137;
                  auVar61._4_4_ = fVar172;
                  auVar61._0_4_ = fVar169;
                  fVar72 = auVar89._8_4_ * fVar138;
                  auVar61._8_4_ = fVar72;
                  fVar73 = auVar89._12_4_ * fVar178;
                  auVar61._12_4_ = fVar73;
                  fVar122 = auVar89._16_4_ * 0.0;
                  auVar61._16_4_ = fVar122;
                  fVar123 = auVar89._20_4_ * 0.0;
                  auVar61._20_4_ = fVar123;
                  fVar124 = auVar89._24_4_ * 0.0;
                  auVar61._24_4_ = fVar124;
                  auVar61._28_4_ = auVar99._28_4_;
                  auVar100 = vsubps_avx512vl(auVar97,auVar61);
                  local_240._0_4_ =
                       (float)((uint)(bVar62 & 1) * (int)fVar169 |
                              (uint)!(bool)(bVar62 & 1) * auVar100._0_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
                  local_240._4_4_ =
                       (float)((uint)bVar16 * (int)fVar172 | (uint)!bVar16 * auVar100._4_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
                  local_240._8_4_ =
                       (float)((uint)bVar16 * (int)fVar72 | (uint)!bVar16 * auVar100._8_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
                  local_240._12_4_ =
                       (float)((uint)bVar16 * (int)fVar73 | (uint)!bVar16 * auVar100._12_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
                  local_240._16_4_ =
                       (float)((uint)bVar16 * (int)fVar122 | (uint)!bVar16 * auVar100._16_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
                  local_240._20_4_ =
                       (float)((uint)bVar16 * (int)fVar123 | (uint)!bVar16 * auVar100._20_4_);
                  bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
                  local_240._24_4_ =
                       (float)((uint)bVar16 * (int)fVar124 | (uint)!bVar16 * auVar100._24_4_);
                  bVar16 = SUB81(uVar64 >> 7,0);
                  local_240._28_4_ =
                       (float)((uint)bVar16 * auVar99._28_4_ | (uint)!bVar16 * auVar100._28_4_);
                  auVar99 = vsubps_avx(ZEXT1632(auVar81),auVar91);
                  auVar82 = vfmadd213ps_fma(auVar99,local_240,auVar91);
                  fVar169 = local_508->depth_scale;
                  auVar37._4_4_ = fVar169;
                  auVar37._0_4_ = fVar169;
                  auVar37._8_4_ = fVar169;
                  auVar37._12_4_ = fVar169;
                  auVar37._16_4_ = fVar169;
                  auVar37._20_4_ = fVar169;
                  auVar37._24_4_ = fVar169;
                  auVar37._28_4_ = fVar169;
                  auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                               CONCAT48(auVar82._8_4_ +
                                                                        auVar82._8_4_,
                                                                        CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                            auVar37);
                  uVar139 = vcmpps_avx512vl(local_200,auVar99,6);
                  if (((byte)uVar139 & bVar71) != 0) {
                    auVar8._0_4_ = ray->tfar;
                    auVar8._4_4_ = ray->mask;
                    auVar8._8_4_ = ray->id;
                    auVar8._12_4_ = ray->flags;
                    uVar63 = vextractps_avx(auVar8,1);
                    auVar147._0_4_ = auVar90._0_4_ * fVar136;
                    auVar147._4_4_ = auVar90._4_4_ * fVar137;
                    auVar147._8_4_ = auVar90._8_4_ * fVar138;
                    auVar147._12_4_ = auVar90._12_4_ * fVar178;
                    auVar147._16_4_ = auVar90._16_4_ * 0.0;
                    auVar147._20_4_ = auVar90._20_4_ * 0.0;
                    auVar147._24_4_ = auVar90._24_4_ * 0.0;
                    auVar147._28_4_ = 0;
                    auVar99 = vsubps_avx512vl(auVar97,auVar147);
                    auVar121._0_4_ =
                         (uint)(bVar62 & 1) * (int)auVar147._0_4_ |
                         (uint)!(bool)(bVar62 & 1) * auVar99._0_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 1) & 1);
                    auVar121._4_4_ =
                         (uint)bVar16 * (int)auVar147._4_4_ | (uint)!bVar16 * auVar99._4_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
                    auVar121._8_4_ =
                         (uint)bVar16 * (int)auVar147._8_4_ | (uint)!bVar16 * auVar99._8_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
                    auVar121._12_4_ =
                         (uint)bVar16 * (int)auVar147._12_4_ | (uint)!bVar16 * auVar99._12_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 4) & 1);
                    auVar121._16_4_ =
                         (uint)bVar16 * (int)auVar147._16_4_ | (uint)!bVar16 * auVar99._16_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
                    auVar121._20_4_ =
                         (uint)bVar16 * (int)auVar147._20_4_ | (uint)!bVar16 * auVar99._20_4_;
                    bVar16 = (bool)((byte)(uVar64 >> 6) & 1);
                    auVar121._24_4_ =
                         (uint)bVar16 * (int)auVar147._24_4_ | (uint)!bVar16 * auVar99._24_4_;
                    auVar121._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar99._28_4_;
                    auVar38._8_4_ = 0x40000000;
                    auVar38._0_8_ = 0x4000000040000000;
                    auVar38._12_4_ = 0x40000000;
                    auVar38._16_4_ = 0x40000000;
                    auVar38._20_4_ = 0x40000000;
                    auVar38._24_4_ = 0x40000000;
                    auVar38._28_4_ = 0x40000000;
                    local_220 = vfmsub132ps_avx512vl(auVar121,auVar97,auVar38);
                    local_1e0 = (int)lVar68;
                    local_1dc = iVar10;
                    local_1d0 = local_460._0_8_;
                    uStack_1c8 = local_460._8_8_;
                    local_1c0 = local_470._0_8_;
                    uStack_1b8 = local_470._8_8_;
                    local_1b0 = local_480._0_8_;
                    uStack_1a8 = local_480._8_8_;
                    pGVar11 = (context->scene->geometries).items[local_510].ptr;
                    if ((pGVar11->mask & uVar63) == 0) {
                      bVar62 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar62 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar82 = vcvtsi2ss_avx512f(auVar95._0_16_,(int)lVar68);
                      fVar169 = auVar82._0_4_;
                      local_180[0] = (fVar169 + local_240._0_4_ + 0.0) * (float)local_2c0._0_4_;
                      local_180[1] = (fVar169 + local_240._4_4_ + 1.0) * (float)local_2c0._4_4_;
                      local_180[2] = (fVar169 + local_240._8_4_ + 2.0) * fStack_2b8;
                      local_180[3] = (fVar169 + local_240._12_4_ + 3.0) * fStack_2b4;
                      fStack_170 = (fVar169 + local_240._16_4_ + 4.0) * fStack_2b0;
                      fStack_16c = (fVar169 + local_240._20_4_ + 5.0) * fStack_2ac;
                      fStack_168 = (fVar169 + local_240._24_4_ + 6.0) * fStack_2a8;
                      fStack_164 = fVar169 + local_240._28_4_ + 7.0;
                      local_160 = local_220;
                      local_140 = local_200;
                      uVar65 = CONCAT71(0,(byte)uVar139 & bVar71);
                      local_490._0_8_ = uVar65;
                      uVar64 = 0;
                      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                        uVar64 = uVar64 + 1;
                      }
                      local_260 = auVar8;
                      local_4a0 = pGVar11;
                      do {
                        auVar75 = auVar191._0_16_;
                        local_4c4 = local_180[uVar64];
                        local_4c0 = *(undefined4 *)(local_160 + uVar64 * 4);
                        local_448 = uVar64;
                        ray->tfar = *(float *)(local_140 + uVar64 * 4);
                        local_500.context = context->user;
                        fVar136 = 1.0 - local_4c4;
                        fVar169 = fVar136 * fVar136 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar136 * fVar136)),
                                                  ZEXT416((uint)(local_4c4 * fVar136)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar136)),
                                                  ZEXT416((uint)(local_4c4 * local_4c4)),
                                                  ZEXT416(0x40000000));
                        fVar136 = auVar82._0_4_ * 3.0;
                        fVar137 = auVar81._0_4_ * 3.0;
                        fVar138 = local_4c4 * local_4c4 * 3.0;
                        auVar168._0_4_ = fVar138 * (float)local_310._0_4_;
                        auVar168._4_4_ = fVar138 * (float)local_310._4_4_;
                        auVar168._8_4_ = fVar138 * fStack_308;
                        auVar168._12_4_ = fVar138 * fStack_304;
                        auVar153._4_4_ = fVar137;
                        auVar153._0_4_ = fVar137;
                        auVar153._8_4_ = fVar137;
                        auVar153._12_4_ = fVar137;
                        auVar82 = vfmadd132ps_fma(auVar153,auVar168,local_480);
                        auVar156._4_4_ = fVar136;
                        auVar156._0_4_ = fVar136;
                        auVar156._8_4_ = fVar136;
                        auVar156._12_4_ = fVar136;
                        auVar82 = vfmadd132ps_fma(auVar156,auVar82,local_470);
                        auVar154._4_4_ = fVar169;
                        auVar154._0_4_ = fVar169;
                        auVar154._8_4_ = fVar169;
                        auVar154._12_4_ = fVar169;
                        auVar82 = vfmadd132ps_fma(auVar154,auVar82,local_460);
                        local_4d0 = vmovlps_avx(auVar82);
                        local_4c8 = vextractps_avx(auVar82,2);
                        local_4bc = (int)local_498;
                        local_4b8 = (int)local_510;
                        local_4b4 = (local_500.context)->instID[0];
                        local_4b0 = (local_500.context)->instPrimID[0];
                        local_52c = -1;
                        local_500.valid = &local_52c;
                        local_500.geometryUserPtr = local_4a0->userPtr;
                        local_500.ray = (RTCRayN *)ray;
                        local_500.hit = (RTCHitN *)&local_4d0;
                        local_500.N = 1;
                        if ((local_4a0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_4a0->occlusionFilterN)(&local_500), context = local_528,
                           *local_500.valid != 0)) {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 == (RTCFilterFunctionN)0x0) ||
                             ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_4a0->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var15)(&local_500), context = local_528, *local_500.valid != 0)))
                             ) {
                            bVar62 = 1;
                            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar190 = ZEXT3264(auVar99);
                            auVar82 = vxorps_avx512vl(auVar75,auVar75);
                            auVar191 = ZEXT1664(auVar82);
                            auVar194 = ZEXT3264(local_3c0);
                            auVar192 = ZEXT3264(local_340);
                            auVar193 = ZEXT3264(local_3e0);
                            auVar199 = ZEXT3264(local_360);
                            auVar198 = ZEXT3264(local_400);
                            auVar196 = ZEXT3264(local_420);
                            auVar197 = ZEXT3264(local_380);
                            auVar195 = ZEXT3264(local_3a0);
                            ray = local_518;
                            break;
                          }
                        }
                        local_518->tfar = (float)local_260._0_4_;
                        uVar67 = local_490._0_8_ ^ 1L << (local_448 & 0x3f);
                        bVar62 = 0;
                        local_490._0_8_ = uVar67;
                        uVar64 = 0;
                        for (uVar65 = uVar67; (uVar65 & 1) == 0;
                            uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                          uVar64 = uVar64 + 1;
                        }
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar190 = ZEXT3264(auVar99);
                        auVar82 = vxorps_avx512vl(auVar75,auVar75);
                        auVar191 = ZEXT1664(auVar82);
                        auVar194 = ZEXT3264(local_3c0);
                        auVar192 = ZEXT3264(local_340);
                        auVar193 = ZEXT3264(local_3e0);
                        auVar199 = ZEXT3264(local_360);
                        auVar198 = ZEXT3264(local_400);
                        auVar196 = ZEXT3264(local_420);
                        auVar197 = ZEXT3264(local_380);
                        auVar195 = ZEXT3264(local_3a0);
                        context = local_528;
                        ray = local_518;
                      } while (uVar67 != 0);
                    }
                    bVar69 = (bool)(bVar69 | bVar62);
                  }
                }
              }
            }
          }
          lVar68 = lVar68 + 8;
        } while ((int)lVar68 < iVar10);
      }
      if (bVar69) {
        return bVar69;
      }
      fVar169 = ray->tfar;
      auVar33._4_4_ = fVar169;
      auVar33._0_4_ = fVar169;
      auVar33._8_4_ = fVar169;
      auVar33._12_4_ = fVar169;
      uVar139 = vcmpps_avx512vl(local_250,auVar33,2);
      uVar63 = (uint)uVar70 & (uint)uVar70 + 0xf & (uint)uVar139;
      uVar70 = (ulong)uVar63;
    } while (uVar63 != 0);
  }
  return bVar69;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }